

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  uint uVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  void *pvVar8;
  __int_type_conflict _Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [28];
  undefined1 auVar30 [28];
  undefined1 auVar31 [28];
  undefined1 auVar32 [28];
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  byte bVar40;
  uint uVar41;
  ulong uVar42;
  uint uVar44;
  long lVar45;
  ulong uVar46;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar47;
  ulong uVar48;
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  undefined1 auVar107 [32];
  undefined1 auVar66 [16];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  int iVar119;
  float t1;
  float fVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar123;
  float fVar124;
  undefined4 uVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar143;
  float fVar144;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  vfloat4 b0;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  vfloat4 b0_1;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar175 [16];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  vfloat4 a0_2;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar215;
  float fVar226;
  float fVar227;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar228;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar229;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar236;
  float fVar245;
  float fVar246;
  vfloat4 a0_1;
  float fVar247;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar248;
  float fVar253;
  float fVar254;
  vfloat4 a0;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  float fVar255;
  undefined1 auVar252 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  undefined1 auVar266 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [64];
  undefined1 auVar269 [64];
  undefined1 auVar270 [64];
  undefined1 auVar271 [64];
  int iVar272;
  undefined1 in_ZMM30 [64];
  undefined1 auVar273 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar274 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  RTCFilterFunctionNArguments local_470;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  uint auStack_3f0 [4];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [16];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  undefined1 local_330 [16];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  uint uStack_280;
  float afStack_27c [7];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar43;
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar108 [32];
  undefined1 auVar110 [32];
  undefined1 auVar112 [32];
  uint uVar118;
  
  PVar3 = prim[1];
  uVar46 = (ulong)(byte)PVar3;
  fVar144 = *(float *)(prim + uVar46 * 0x19 + 0x12);
  auVar49 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar49 = vinsertps_avx(auVar49,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar61 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar121 = vinsertps_avx(auVar61,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar51 = vsubps_avx(auVar49,*(undefined1 (*) [16])(prim + uVar46 * 0x19 + 6));
  fVar143 = fVar144 * auVar51._0_4_;
  fVar120 = fVar144 * auVar121._0_4_;
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar46 * 4 + 6);
  auVar81 = vpmovsxbd_avx2(auVar49);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar46 * 5 + 6);
  auVar79 = vpmovsxbd_avx2(auVar61);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + uVar46 * 6 + 6);
  auVar95 = vpmovsxbd_avx2(auVar60);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar46 * 0xb + 6);
  auVar96 = vpmovsxbd_avx2(auVar59);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  auVar89 = vpmovsxbd_avx2(auVar58);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar97 = vcvtdq2ps_avx(auVar89);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + (uint)(byte)PVar3 * 0xc + uVar46 + 6);
  auVar80 = vpmovsxbd_avx2(auVar57);
  auVar80 = vcvtdq2ps_avx(auVar80);
  uVar48 = (ulong)(uint)((int)(uVar46 * 9) * 2);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar48 + 6);
  auVar86 = vpmovsxbd_avx2(auVar56);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar48 + uVar46 + 6);
  auVar87 = vpmovsxbd_avx2(auVar55);
  auVar87 = vcvtdq2ps_avx(auVar87);
  uVar42 = (ulong)(uint)((int)(uVar46 * 5) << 2);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar42 + 6);
  auVar78 = vpmovsxbd_avx2(auVar54);
  auVar88 = vcvtdq2ps_avx(auVar78);
  auVar159._4_4_ = fVar120;
  auVar159._0_4_ = fVar120;
  auVar159._8_4_ = fVar120;
  auVar159._12_4_ = fVar120;
  auVar159._16_4_ = fVar120;
  auVar159._20_4_ = fVar120;
  auVar159._24_4_ = fVar120;
  auVar159._28_4_ = fVar120;
  auVar264._8_4_ = 1;
  auVar264._0_8_ = 0x100000001;
  auVar264._12_4_ = 1;
  auVar264._16_4_ = 1;
  auVar264._20_4_ = 1;
  auVar264._24_4_ = 1;
  auVar264._28_4_ = 1;
  auVar76 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar91 = ZEXT1632(CONCAT412(fVar144 * auVar121._12_4_,
                               CONCAT48(fVar144 * auVar121._8_4_,
                                        CONCAT44(fVar144 * auVar121._4_4_,fVar120))));
  auVar90 = vpermps_avx2(auVar264,auVar91);
  auVar77 = vpermps_avx512vl(auVar76,auVar91);
  fVar120 = auVar77._0_4_;
  fVar215 = auVar77._4_4_;
  auVar91._4_4_ = fVar215 * auVar95._4_4_;
  auVar91._0_4_ = fVar120 * auVar95._0_4_;
  fVar226 = auVar77._8_4_;
  auVar91._8_4_ = fVar226 * auVar95._8_4_;
  fVar227 = auVar77._12_4_;
  auVar91._12_4_ = fVar227 * auVar95._12_4_;
  fVar123 = auVar77._16_4_;
  auVar91._16_4_ = fVar123 * auVar95._16_4_;
  fVar124 = auVar77._20_4_;
  auVar91._20_4_ = fVar124 * auVar95._20_4_;
  fVar228 = auVar77._24_4_;
  auVar91._24_4_ = fVar228 * auVar95._24_4_;
  auVar91._28_4_ = auVar89._28_4_;
  auVar89._4_4_ = auVar80._4_4_ * fVar215;
  auVar89._0_4_ = auVar80._0_4_ * fVar120;
  auVar89._8_4_ = auVar80._8_4_ * fVar226;
  auVar89._12_4_ = auVar80._12_4_ * fVar227;
  auVar89._16_4_ = auVar80._16_4_ * fVar123;
  auVar89._20_4_ = auVar80._20_4_ * fVar124;
  auVar89._24_4_ = auVar80._24_4_ * fVar228;
  auVar89._28_4_ = auVar78._28_4_;
  auVar78._4_4_ = auVar88._4_4_ * fVar215;
  auVar78._0_4_ = auVar88._0_4_ * fVar120;
  auVar78._8_4_ = auVar88._8_4_ * fVar226;
  auVar78._12_4_ = auVar88._12_4_ * fVar227;
  auVar78._16_4_ = auVar88._16_4_ * fVar123;
  auVar78._20_4_ = auVar88._20_4_ * fVar124;
  auVar78._24_4_ = auVar88._24_4_ * fVar228;
  auVar78._28_4_ = auVar77._28_4_;
  auVar49 = vfmadd231ps_fma(auVar91,auVar90,auVar79);
  auVar61 = vfmadd231ps_fma(auVar89,auVar90,auVar97);
  auVar60 = vfmadd231ps_fma(auVar78,auVar87,auVar90);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar159,auVar81);
  auVar61 = vfmadd231ps_fma(ZEXT1632(auVar61),auVar159,auVar96);
  auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar86,auVar159);
  auVar251._4_4_ = fVar143;
  auVar251._0_4_ = fVar143;
  auVar251._8_4_ = fVar143;
  auVar251._12_4_ = fVar143;
  auVar251._16_4_ = fVar143;
  auVar251._20_4_ = fVar143;
  auVar251._24_4_ = fVar143;
  auVar251._28_4_ = fVar143;
  auVar78 = ZEXT1632(CONCAT412(fVar144 * auVar51._12_4_,
                               CONCAT48(fVar144 * auVar51._8_4_,
                                        CONCAT44(fVar144 * auVar51._4_4_,fVar143))));
  auVar89 = vpermps_avx2(auVar264,auVar78);
  auVar78 = vpermps_avx512vl(auVar76,auVar78);
  fVar144 = auVar78._0_4_;
  fVar120 = auVar78._4_4_;
  auVar90._4_4_ = fVar120 * auVar95._4_4_;
  auVar90._0_4_ = fVar144 * auVar95._0_4_;
  fVar215 = auVar78._8_4_;
  auVar90._8_4_ = fVar215 * auVar95._8_4_;
  fVar226 = auVar78._12_4_;
  auVar90._12_4_ = fVar226 * auVar95._12_4_;
  fVar227 = auVar78._16_4_;
  auVar90._16_4_ = fVar227 * auVar95._16_4_;
  fVar123 = auVar78._20_4_;
  auVar90._20_4_ = fVar123 * auVar95._20_4_;
  fVar124 = auVar78._24_4_;
  auVar90._24_4_ = fVar124 * auVar95._24_4_;
  auVar90._28_4_ = 1;
  auVar76._4_4_ = auVar80._4_4_ * fVar120;
  auVar76._0_4_ = auVar80._0_4_ * fVar144;
  auVar76._8_4_ = auVar80._8_4_ * fVar215;
  auVar76._12_4_ = auVar80._12_4_ * fVar226;
  auVar76._16_4_ = auVar80._16_4_ * fVar227;
  auVar76._20_4_ = auVar80._20_4_ * fVar123;
  auVar76._24_4_ = auVar80._24_4_ * fVar124;
  auVar76._28_4_ = auVar95._28_4_;
  auVar80._4_4_ = auVar88._4_4_ * fVar120;
  auVar80._0_4_ = auVar88._0_4_ * fVar144;
  auVar80._8_4_ = auVar88._8_4_ * fVar215;
  auVar80._12_4_ = auVar88._12_4_ * fVar226;
  auVar80._16_4_ = auVar88._16_4_ * fVar227;
  auVar80._20_4_ = auVar88._20_4_ * fVar123;
  auVar80._24_4_ = auVar88._24_4_ * fVar124;
  auVar80._28_4_ = auVar78._28_4_;
  auVar59 = vfmadd231ps_fma(auVar90,auVar89,auVar79);
  auVar58 = vfmadd231ps_fma(auVar76,auVar89,auVar97);
  auVar57 = vfmadd231ps_fma(auVar80,auVar89,auVar87);
  auVar59 = vfmadd231ps_fma(ZEXT1632(auVar59),auVar251,auVar81);
  auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar251,auVar96);
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  auVar99._16_4_ = 0x7fffffff;
  auVar99._20_4_ = 0x7fffffff;
  auVar99._24_4_ = 0x7fffffff;
  auVar99._28_4_ = 0x7fffffff;
  auVar57 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar251,auVar86);
  auVar81 = vandps_avx(ZEXT1632(auVar49),auVar99);
  auVar152._8_4_ = 0x219392ef;
  auVar152._0_8_ = 0x219392ef219392ef;
  auVar152._12_4_ = 0x219392ef;
  auVar152._16_4_ = 0x219392ef;
  auVar152._20_4_ = 0x219392ef;
  auVar152._24_4_ = 0x219392ef;
  auVar152._28_4_ = 0x219392ef;
  uVar48 = vcmpps_avx512vl(auVar81,auVar152,1);
  bVar10 = (bool)((byte)uVar48 & 1);
  auVar77._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar49._0_4_;
  bVar10 = (bool)((byte)(uVar48 >> 1) & 1);
  auVar77._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar49._4_4_;
  bVar10 = (bool)((byte)(uVar48 >> 2) & 1);
  auVar77._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar49._8_4_;
  bVar10 = (bool)((byte)(uVar48 >> 3) & 1);
  auVar77._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar49._12_4_;
  auVar77._16_4_ = (uint)((byte)(uVar48 >> 4) & 1) * 0x219392ef;
  auVar77._20_4_ = (uint)((byte)(uVar48 >> 5) & 1) * 0x219392ef;
  auVar77._24_4_ = (uint)((byte)(uVar48 >> 6) & 1) * 0x219392ef;
  auVar77._28_4_ = (uint)(byte)(uVar48 >> 7) * 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar61),auVar99);
  uVar48 = vcmpps_avx512vl(auVar81,auVar152,1);
  bVar10 = (bool)((byte)uVar48 & 1);
  auVar92._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar61._0_4_;
  bVar10 = (bool)((byte)(uVar48 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar61._4_4_;
  bVar10 = (bool)((byte)(uVar48 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar61._8_4_;
  bVar10 = (bool)((byte)(uVar48 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar61._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar48 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar48 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar48 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar48 >> 7) * 0x219392ef;
  auVar81 = vandps_avx(ZEXT1632(auVar60),auVar99);
  uVar48 = vcmpps_avx512vl(auVar81,auVar152,1);
  bVar10 = (bool)((byte)uVar48 & 1);
  auVar81._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar60._0_4_;
  bVar10 = (bool)((byte)(uVar48 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar60._4_4_;
  bVar10 = (bool)((byte)(uVar48 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar60._8_4_;
  bVar10 = (bool)((byte)(uVar48 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * auVar60._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar48 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar48 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar48 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar48 >> 7) * 0x219392ef;
  auVar79 = vrcp14ps_avx512vl(auVar77);
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = &DAT_3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar100._16_4_ = 0x3f800000;
  auVar100._20_4_ = 0x3f800000;
  auVar100._24_4_ = 0x3f800000;
  auVar100._28_4_ = 0x3f800000;
  auVar49 = vfnmadd213ps_fma(auVar77,auVar79,auVar100);
  auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar92);
  auVar61 = vfnmadd213ps_fma(auVar92,auVar79,auVar100);
  auVar61 = vfmadd132ps_fma(ZEXT1632(auVar61),auVar79,auVar79);
  auVar79 = vrcp14ps_avx512vl(auVar81);
  auVar60 = vfnmadd213ps_fma(auVar81,auVar79,auVar100);
  auVar60 = vfmadd132ps_fma(ZEXT1632(auVar60),auVar79,auVar79);
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar46 * 7 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar59));
  auVar86._4_4_ = auVar49._4_4_ * auVar81._4_4_;
  auVar86._0_4_ = auVar49._0_4_ * auVar81._0_4_;
  auVar86._8_4_ = auVar49._8_4_ * auVar81._8_4_;
  auVar86._12_4_ = auVar49._12_4_ * auVar81._12_4_;
  auVar86._16_4_ = auVar81._16_4_ * 0.0;
  auVar86._20_4_ = auVar81._20_4_ * 0.0;
  auVar86._24_4_ = auVar81._24_4_ * 0.0;
  auVar86._28_4_ = auVar81._28_4_;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar46 * 9 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar59));
  auVar80 = vpbroadcastd_avx512vl();
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar3 * 0x10 + 6));
  auVar98._0_4_ = auVar49._0_4_ * auVar81._0_4_;
  auVar98._4_4_ = auVar49._4_4_ * auVar81._4_4_;
  auVar98._8_4_ = auVar49._8_4_ * auVar81._8_4_;
  auVar98._12_4_ = auVar49._12_4_ * auVar81._12_4_;
  auVar98._16_4_ = auVar81._16_4_ * 0.0;
  auVar98._20_4_ = auVar81._20_4_ * 0.0;
  auVar98._24_4_ = auVar81._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar3 * 0x10 + uVar46 * -2 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar58));
  auVar87._4_4_ = auVar61._4_4_ * auVar81._4_4_;
  auVar87._0_4_ = auVar61._0_4_ * auVar81._0_4_;
  auVar87._8_4_ = auVar61._8_4_ * auVar81._8_4_;
  auVar87._12_4_ = auVar61._12_4_ * auVar81._12_4_;
  auVar87._16_4_ = auVar81._16_4_ * 0.0;
  auVar87._20_4_ = auVar81._20_4_ * 0.0;
  auVar87._24_4_ = auVar81._24_4_ * 0.0;
  auVar87._28_4_ = auVar81._28_4_;
  auVar81 = vcvtdq2ps_avx(auVar79);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar58));
  auVar94._0_4_ = auVar61._0_4_ * auVar81._0_4_;
  auVar94._4_4_ = auVar61._4_4_ * auVar81._4_4_;
  auVar94._8_4_ = auVar61._8_4_ * auVar81._8_4_;
  auVar94._12_4_ = auVar61._12_4_ * auVar81._12_4_;
  auVar94._16_4_ = auVar81._16_4_ * 0.0;
  auVar94._20_4_ = auVar81._20_4_ * 0.0;
  auVar94._24_4_ = auVar81._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar42 + uVar46 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar57));
  auVar88._4_4_ = auVar81._4_4_ * auVar60._4_4_;
  auVar88._0_4_ = auVar81._0_4_ * auVar60._0_4_;
  auVar88._8_4_ = auVar81._8_4_ * auVar60._8_4_;
  auVar88._12_4_ = auVar81._12_4_ * auVar60._12_4_;
  auVar88._16_4_ = auVar81._16_4_ * 0.0;
  auVar88._20_4_ = auVar81._20_4_ * 0.0;
  auVar88._24_4_ = auVar81._24_4_ * 0.0;
  auVar88._28_4_ = auVar81._28_4_;
  auVar81 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar46 * 0x17 + 6));
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar81 = vsubps_avx(auVar81,ZEXT1632(auVar57));
  auVar93._0_4_ = auVar60._0_4_ * auVar81._0_4_;
  auVar93._4_4_ = auVar60._4_4_ * auVar81._4_4_;
  auVar93._8_4_ = auVar60._8_4_ * auVar81._8_4_;
  auVar93._12_4_ = auVar60._12_4_ * auVar81._12_4_;
  auVar93._16_4_ = auVar81._16_4_ * 0.0;
  auVar93._20_4_ = auVar81._20_4_ * 0.0;
  auVar93._24_4_ = auVar81._24_4_ * 0.0;
  auVar93._28_4_ = 0;
  auVar81 = vpminsd_avx2(auVar86,auVar98);
  auVar79 = vpminsd_avx2(auVar87,auVar94);
  auVar81 = vmaxps_avx(auVar81,auVar79);
  auVar79 = vpminsd_avx2(auVar88,auVar93);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar95._4_4_ = uVar125;
  auVar95._0_4_ = uVar125;
  auVar95._8_4_ = uVar125;
  auVar95._12_4_ = uVar125;
  auVar95._16_4_ = uVar125;
  auVar95._20_4_ = uVar125;
  auVar95._24_4_ = uVar125;
  auVar95._28_4_ = uVar125;
  auVar79 = vmaxps_avx512vl(auVar79,auVar95);
  auVar81 = vmaxps_avx(auVar81,auVar79);
  auVar79._8_4_ = 0x3f7ffffa;
  auVar79._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar79._12_4_ = 0x3f7ffffa;
  auVar79._16_4_ = 0x3f7ffffa;
  auVar79._20_4_ = 0x3f7ffffa;
  auVar79._24_4_ = 0x3f7ffffa;
  auVar79._28_4_ = 0x3f7ffffa;
  local_200 = vmulps_avx512vl(auVar81,auVar79);
  auVar81 = vpmaxsd_avx2(auVar86,auVar98);
  auVar79 = vpmaxsd_avx2(auVar87,auVar94);
  auVar81 = vminps_avx(auVar81,auVar79);
  auVar79 = vpmaxsd_avx2(auVar88,auVar93);
  uVar125 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar96._4_4_ = uVar125;
  auVar96._0_4_ = uVar125;
  auVar96._8_4_ = uVar125;
  auVar96._12_4_ = uVar125;
  auVar96._16_4_ = uVar125;
  auVar96._20_4_ = uVar125;
  auVar96._24_4_ = uVar125;
  auVar96._28_4_ = uVar125;
  auVar79 = vminps_avx512vl(auVar79,auVar96);
  auVar81 = vminps_avx(auVar81,auVar79);
  auVar97._8_4_ = 0x3f800003;
  auVar97._0_8_ = 0x3f8000033f800003;
  auVar97._12_4_ = 0x3f800003;
  auVar97._16_4_ = 0x3f800003;
  auVar97._20_4_ = 0x3f800003;
  auVar97._24_4_ = 0x3f800003;
  auVar97._28_4_ = 0x3f800003;
  auVar81 = vmulps_avx512vl(auVar81,auVar97);
  uVar19 = vpcmpgtd_avx512vl(auVar80,_DAT_0205a920);
  uVar18 = vcmpps_avx512vl(local_200,auVar81,2);
  if ((byte)((byte)uVar18 & (byte)uVar19) == 0) {
    return;
  }
  uVar48 = (ulong)(byte)((byte)uVar18 & (byte)uVar19);
  local_260 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar61 = auVar81._16_16_;
  auVar49 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar274 = ZEXT1664(auVar49);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar266 = ZEXT1664(auVar49);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar267 = ZEXT1664(auVar49);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar268 = ZEXT1664(auVar49);
  auVar49 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar273 = ZEXT1664(auVar49);
LAB_01d66369:
  lVar45 = 0;
  for (uVar42 = uVar48; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
    lVar45 = lVar45 + 1;
  }
  uVar47 = *(uint *)(prim + 2);
  uVar4 = *(uint *)(prim + lVar45 * 4 + 6);
  pGVar6 = (context->scene->geometries).items[uVar47].ptr;
  uVar42 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar4);
  p_Var7 = pGVar6[1].intersectionFilterN;
  pvVar8 = pGVar6[2].userPtr;
  _Var9 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar49 = *(undefined1 (*) [16])(_Var9 + uVar42 * (long)pvVar8);
  auVar60 = *(undefined1 (*) [16])(_Var9 + (uVar42 + 1) * (long)pvVar8);
  auVar59 = *(undefined1 (*) [16])(_Var9 + (uVar42 + 2) * (long)pvVar8);
  auVar58 = *(undefined1 (*) [16])(_Var9 + (long)pvVar8 * (uVar42 + 3));
  lVar45 = *(long *)&pGVar6[1].time_range.upper;
  auVar57 = *(undefined1 (*) [16])(lVar45 + (long)p_Var7 * uVar42);
  auVar56 = *(undefined1 (*) [16])(lVar45 + (long)p_Var7 * (uVar42 + 1));
  auVar55 = *(undefined1 (*) [16])(lVar45 + (long)p_Var7 * (uVar42 + 2));
  uVar48 = uVar48 - 1 & uVar48;
  auVar54 = *(undefined1 (*) [16])(lVar45 + (long)p_Var7 * (uVar42 + 3));
  if (uVar48 != 0) {
    uVar46 = uVar48 - 1 & uVar48;
    for (uVar42 = uVar48; (uVar42 & 1) == 0; uVar42 = uVar42 >> 1 | 0x8000000000000000) {
    }
    if (uVar46 != 0) {
      for (; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar121 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar121 = vinsertps_avx(auVar121,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar144 = *(float *)(ray + k * 4 + 0x60);
  auVar63 = auVar274._0_16_;
  auVar50 = vmulps_avx512vl(auVar54,auVar63);
  auVar256._8_4_ = 0x3e2aaaab;
  auVar256._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar256._12_4_ = 0x3e2aaaab;
  auVar51 = vfmadd213ps_fma(auVar256,auVar55,auVar50);
  auVar262._8_4_ = 0x3f2aaaab;
  auVar262._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar262._12_4_ = 0x3f2aaaab;
  auVar51 = vfmadd231ps_fma(auVar51,auVar56,auVar262);
  auVar126 = vfmadd231ps_fma(auVar51,auVar57,auVar256);
  auVar62 = auVar266._0_16_;
  auVar51 = vfmadd231ps_avx512vl(auVar50,auVar55,auVar62);
  auVar51 = vfnmadd231ps_avx512vl(auVar51,auVar56,auVar63);
  auVar52 = vfnmadd231ps_avx512vl(auVar51,auVar57,auVar62);
  auVar50 = vmulps_avx512vl(auVar58,auVar63);
  auVar51 = vfmadd213ps_fma(auVar256,auVar59,auVar50);
  auVar51 = vfmadd231ps_fma(auVar51,auVar60,auVar262);
  auVar51 = vfmadd231ps_fma(auVar51,auVar49,auVar256);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar59,auVar62);
  auVar50 = vfnmadd231ps_avx512vl(auVar50,auVar60,auVar63);
  auVar53 = vfnmadd231ps_avx512vl(auVar50,auVar49,auVar62);
  auVar66._0_4_ = auVar54._0_4_ * 0.16666667;
  auVar66._4_4_ = auVar54._4_4_ * 0.16666667;
  auVar66._8_4_ = auVar54._8_4_ * 0.16666667;
  auVar66._12_4_ = auVar54._12_4_ * 0.16666667;
  auVar50 = vfmadd231ps_fma(auVar66,auVar55,auVar262);
  auVar50 = vfmadd231ps_fma(auVar50,auVar56,auVar256);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar57,auVar63);
  auVar54 = vmulps_avx512vl(auVar54,auVar62);
  auVar55 = vfmadd231ps_avx512vl(auVar54,auVar63,auVar55);
  auVar56 = vfnmadd231ps_avx512vl(auVar55,auVar62,auVar56);
  auVar55 = vfnmadd231ps_avx512vl(auVar56,auVar63,auVar57);
  auVar208._0_4_ = auVar58._0_4_ * 0.16666667;
  auVar208._4_4_ = auVar58._4_4_ * 0.16666667;
  auVar208._8_4_ = auVar58._8_4_ * 0.16666667;
  auVar208._12_4_ = auVar58._12_4_ * 0.16666667;
  auVar57 = vfmadd231ps_fma(auVar208,auVar59,auVar262);
  auVar57 = vfmadd231ps_fma(auVar57,auVar60,auVar256);
  auVar57 = vfmadd231ps_avx512vl(auVar57,auVar49,auVar63);
  auVar58 = vmulps_avx512vl(auVar58,auVar62);
  auVar59 = vfmadd231ps_avx512vl(auVar58,auVar63,auVar59);
  auVar60 = vfnmadd231ps_avx512vl(auVar59,auVar62,auVar60);
  auVar56 = vfnmadd231ps_avx512vl(auVar60,auVar63,auVar49);
  auVar49 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar60 = vshufps_avx(auVar51,auVar51,0xc9);
  fVar123 = auVar52._0_4_;
  auVar70._0_4_ = fVar123 * auVar60._0_4_;
  fVar124 = auVar52._4_4_;
  auVar70._4_4_ = fVar124 * auVar60._4_4_;
  fVar228 = auVar52._8_4_;
  auVar70._8_4_ = fVar228 * auVar60._8_4_;
  fVar143 = auVar52._12_4_;
  auVar70._12_4_ = fVar143 * auVar60._12_4_;
  auVar60 = vfmsub231ps_fma(auVar70,auVar49,auVar51);
  auVar59 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar60 = vshufps_avx(auVar53,auVar53,0xc9);
  auVar67._0_4_ = fVar123 * auVar60._0_4_;
  auVar67._4_4_ = fVar124 * auVar60._4_4_;
  auVar67._8_4_ = fVar228 * auVar60._8_4_;
  auVar67._12_4_ = fVar143 * auVar60._12_4_;
  auVar49 = vfmsub231ps_fma(auVar67,auVar49,auVar53);
  auVar58 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar49 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar60 = vshufps_avx(auVar57,auVar57,0xc9);
  fVar229 = auVar55._0_4_;
  auVar72._0_4_ = fVar229 * auVar60._0_4_;
  fVar162 = auVar55._4_4_;
  auVar72._4_4_ = fVar162 * auVar60._4_4_;
  fVar163 = auVar55._8_4_;
  auVar72._8_4_ = fVar163 * auVar60._8_4_;
  fVar164 = auVar55._12_4_;
  auVar72._12_4_ = fVar164 * auVar60._12_4_;
  auVar60 = vfmsub231ps_fma(auVar72,auVar49,auVar57);
  auVar57 = vshufps_avx(auVar60,auVar60,0xc9);
  auVar60 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar209._0_4_ = auVar60._0_4_ * fVar229;
  auVar209._4_4_ = auVar60._4_4_ * fVar162;
  auVar209._8_4_ = auVar60._8_4_ * fVar163;
  auVar209._12_4_ = auVar60._12_4_ * fVar164;
  auVar60 = vfmsub231ps_fma(auVar209,auVar49,auVar56);
  auVar49 = vdpps_avx(auVar59,auVar59,0x7f);
  auVar56 = vshufps_avx(auVar60,auVar60,0xc9);
  fVar215 = auVar49._0_4_;
  auVar83._16_16_ = auVar61;
  auVar83._0_16_ = auVar63;
  auVar82._4_28_ = auVar83._4_28_;
  auVar82._0_4_ = fVar215;
  auVar60 = vrsqrt14ss_avx512f(auVar63,auVar82._0_16_);
  fVar120 = auVar60._0_4_;
  auVar54 = vmulss_avx512f(auVar49,ZEXT416(0xbf000000));
  auVar60 = vdpps_avx(auVar59,auVar58,0x7f);
  fVar120 = fVar120 * 1.5 + auVar54._0_4_ * fVar120 * fVar120 * fVar120;
  fVar236 = fVar120 * auVar59._0_4_;
  fVar245 = fVar120 * auVar59._4_4_;
  fVar246 = fVar120 * auVar59._8_4_;
  fVar247 = fVar120 * auVar59._12_4_;
  auVar216._0_4_ = auVar58._0_4_ * fVar215;
  auVar216._4_4_ = auVar58._4_4_ * fVar215;
  auVar216._8_4_ = auVar58._8_4_ * fVar215;
  auVar216._12_4_ = auVar58._12_4_ * fVar215;
  fVar215 = auVar60._0_4_;
  auVar181._0_4_ = fVar215 * auVar59._0_4_;
  auVar181._4_4_ = fVar215 * auVar59._4_4_;
  auVar181._8_4_ = fVar215 * auVar59._8_4_;
  auVar181._12_4_ = fVar215 * auVar59._12_4_;
  auVar60 = vsubps_avx(auVar216,auVar181);
  auVar59 = vrcp14ss_avx512f(auVar63,auVar82._0_16_);
  auVar49 = vfnmadd213ss_avx512f(auVar49,auVar59,ZEXT416(0x40000000));
  fVar226 = auVar59._0_4_ * auVar49._0_4_;
  auVar49 = vdpps_avx(auVar57,auVar57,0x7f);
  fVar227 = auVar49._0_4_;
  auVar85._16_16_ = auVar61;
  auVar85._0_16_ = auVar63;
  auVar84._4_28_ = auVar85._4_28_;
  auVar84._0_4_ = fVar227;
  auVar61 = vrsqrt14ss_avx512f(auVar63,auVar84._0_16_);
  fVar215 = auVar61._0_4_;
  auVar61 = vmulss_avx512f(auVar49,ZEXT416(0xbf000000));
  fVar215 = fVar215 * 1.5 + auVar61._0_4_ * fVar215 * fVar215 * fVar215;
  auVar61 = vdpps_avx(auVar57,auVar56,0x7f);
  fVar248 = fVar215 * auVar57._0_4_;
  fVar253 = fVar215 * auVar57._4_4_;
  fVar254 = fVar215 * auVar57._8_4_;
  fVar255 = fVar215 * auVar57._12_4_;
  auVar68._0_4_ = fVar227 * auVar56._0_4_;
  auVar68._4_4_ = fVar227 * auVar56._4_4_;
  auVar68._8_4_ = fVar227 * auVar56._8_4_;
  auVar68._12_4_ = fVar227 * auVar56._12_4_;
  fVar227 = auVar61._0_4_;
  auVar73._0_4_ = fVar227 * auVar57._0_4_;
  auVar73._4_4_ = fVar227 * auVar57._4_4_;
  auVar73._8_4_ = fVar227 * auVar57._8_4_;
  auVar73._12_4_ = fVar227 * auVar57._12_4_;
  auVar59 = vsubps_avx(auVar68,auVar73);
  auVar61 = vrcp14ss_avx512f(auVar63,auVar84._0_16_);
  auVar49 = vfnmadd213ss_avx512f(auVar49,auVar61,ZEXT416(0x40000000));
  fVar227 = auVar49._0_4_ * auVar61._0_4_;
  auVar49 = vshufps_avx(auVar126,auVar126,0xff);
  auVar192._0_4_ = fVar236 * auVar49._0_4_;
  auVar192._4_4_ = fVar245 * auVar49._4_4_;
  auVar192._8_4_ = fVar246 * auVar49._8_4_;
  auVar192._12_4_ = fVar247 * auVar49._12_4_;
  local_310 = vsubps_avx(auVar126,auVar192);
  auVar61 = vshufps_avx(auVar52,auVar52,0xff);
  auVar69._0_4_ = auVar61._0_4_ * fVar236 + auVar49._0_4_ * fVar120 * fVar226 * auVar60._0_4_;
  auVar69._4_4_ = auVar61._4_4_ * fVar245 + auVar49._4_4_ * fVar120 * fVar226 * auVar60._4_4_;
  auVar69._8_4_ = auVar61._8_4_ * fVar246 + auVar49._8_4_ * fVar120 * fVar226 * auVar60._8_4_;
  auVar69._12_4_ = auVar61._12_4_ * fVar247 + auVar49._12_4_ * fVar120 * fVar226 * auVar60._12_4_;
  auVar60 = vsubps_avx(auVar52,auVar69);
  local_320._0_4_ = auVar192._0_4_ + auVar126._0_4_;
  local_320._4_4_ = auVar192._4_4_ + auVar126._4_4_;
  fStack_318 = auVar192._8_4_ + auVar126._8_4_;
  fStack_314 = auVar192._12_4_ + auVar126._12_4_;
  auVar49 = vshufps_avx(auVar50,auVar50,0xff);
  auVar172._0_4_ = fVar248 * auVar49._0_4_;
  auVar172._4_4_ = fVar253 * auVar49._4_4_;
  auVar172._8_4_ = fVar254 * auVar49._8_4_;
  auVar172._12_4_ = fVar255 * auVar49._12_4_;
  local_330 = vsubps_avx512vl(auVar50,auVar172);
  auVar61 = vshufps_avx(auVar55,auVar55,0xff);
  auVar52._0_4_ = auVar61._0_4_ * fVar248 + auVar49._0_4_ * fVar215 * auVar59._0_4_ * fVar227;
  auVar52._4_4_ = auVar61._4_4_ * fVar253 + auVar49._4_4_ * fVar215 * auVar59._4_4_ * fVar227;
  auVar52._8_4_ = auVar61._8_4_ * fVar254 + auVar49._8_4_ * fVar215 * auVar59._8_4_ * fVar227;
  auVar52._12_4_ = auVar61._12_4_ * fVar255 + auVar49._12_4_ * fVar215 * auVar59._12_4_ * fVar227;
  auVar49 = vsubps_avx(auVar55,auVar52);
  local_340._0_4_ = auVar50._0_4_ + auVar172._0_4_;
  local_340._4_4_ = auVar50._4_4_ + auVar172._4_4_;
  fStack_338 = auVar50._8_4_ + auVar172._8_4_;
  fStack_334 = auVar50._12_4_ + auVar172._12_4_;
  auVar64._0_4_ = auVar60._0_4_ * 0.33333334;
  auVar64._4_4_ = auVar60._4_4_ * 0.33333334;
  auVar64._8_4_ = auVar60._8_4_ * 0.33333334;
  auVar64._12_4_ = auVar60._12_4_ * 0.33333334;
  local_350 = vaddps_avx512vl(local_310,auVar64);
  auVar75._0_4_ = auVar49._0_4_ * 0.33333334;
  auVar75._4_4_ = auVar49._4_4_ * 0.33333334;
  auVar75._8_4_ = auVar49._8_4_ * 0.33333334;
  auVar75._12_4_ = auVar49._12_4_ * 0.33333334;
  local_360 = vsubps_avx512vl(local_330,auVar75);
  auVar51._0_4_ = (fVar123 + auVar69._0_4_) * 0.33333334;
  auVar51._4_4_ = (fVar124 + auVar69._4_4_) * 0.33333334;
  auVar51._8_4_ = (fVar228 + auVar69._8_4_) * 0.33333334;
  auVar51._12_4_ = (fVar143 + auVar69._12_4_) * 0.33333334;
  _local_370 = vaddps_avx512vl(_local_320,auVar51);
  auVar126._0_4_ = (fVar229 + auVar52._0_4_) * 0.33333334;
  auVar126._4_4_ = (fVar162 + auVar52._4_4_) * 0.33333334;
  auVar126._8_4_ = (fVar163 + auVar52._8_4_) * 0.33333334;
  auVar126._12_4_ = (fVar164 + auVar52._12_4_) * 0.33333334;
  _local_380 = vsubps_avx512vl(_local_340,auVar126);
  local_290 = vsubps_avx(local_310,auVar121);
  uVar125 = local_290._0_4_;
  auVar62._4_4_ = uVar125;
  auVar62._0_4_ = uVar125;
  auVar62._8_4_ = uVar125;
  auVar62._12_4_ = uVar125;
  auVar49 = vshufps_avx(local_290,local_290,0x55);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  auVar61 = vshufps_avx(local_290,local_290,0xaa);
  fVar120 = pre->ray_space[k].vz.field_0.m128[0];
  fVar215 = pre->ray_space[k].vz.field_0.m128[1];
  fVar226 = pre->ray_space[k].vz.field_0.m128[2];
  fVar227 = pre->ray_space[k].vz.field_0.m128[3];
  auVar50._0_4_ = fVar120 * auVar61._0_4_;
  auVar50._4_4_ = fVar215 * auVar61._4_4_;
  auVar50._8_4_ = fVar226 * auVar61._8_4_;
  auVar50._12_4_ = fVar227 * auVar61._12_4_;
  auVar49 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar2,auVar49);
  auVar56 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar62);
  local_2a0 = vsubps_avx512vl(local_350,auVar121);
  uVar125 = local_2a0._0_4_;
  auVar65._4_4_ = uVar125;
  auVar65._0_4_ = uVar125;
  auVar65._8_4_ = uVar125;
  auVar65._12_4_ = uVar125;
  auVar49 = vshufps_avx(local_2a0,local_2a0,0x55);
  auVar61 = vshufps_avx(local_2a0,local_2a0,0xaa);
  auVar63._0_4_ = fVar120 * auVar61._0_4_;
  auVar63._4_4_ = fVar215 * auVar61._4_4_;
  auVar63._8_4_ = fVar226 * auVar61._8_4_;
  auVar63._12_4_ = fVar227 * auVar61._12_4_;
  auVar49 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar2,auVar49);
  auVar55 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar65);
  local_2b0 = vsubps_avx512vl(local_360,auVar121);
  uVar125 = local_2b0._0_4_;
  auVar173._4_4_ = uVar125;
  auVar173._0_4_ = uVar125;
  auVar173._8_4_ = uVar125;
  auVar173._12_4_ = uVar125;
  auVar49 = vshufps_avx(local_2b0,local_2b0,0x55);
  auVar61 = vshufps_avx(local_2b0,local_2b0,0xaa);
  auVar71._0_4_ = fVar120 * auVar61._0_4_;
  auVar71._4_4_ = fVar215 * auVar61._4_4_;
  auVar71._8_4_ = fVar226 * auVar61._8_4_;
  auVar71._12_4_ = fVar227 * auVar61._12_4_;
  auVar49 = vfmadd231ps_fma(auVar71,(undefined1  [16])aVar2,auVar49);
  auVar54 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar173);
  local_2c0 = vsubps_avx512vl(local_330,auVar121);
  uVar125 = local_2c0._0_4_;
  auVar193._4_4_ = uVar125;
  auVar193._0_4_ = uVar125;
  auVar193._8_4_ = uVar125;
  auVar193._12_4_ = uVar125;
  auVar49 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar61 = vshufps_avx(local_2c0,local_2c0,0xaa);
  auVar174._0_4_ = fVar120 * auVar61._0_4_;
  auVar174._4_4_ = fVar215 * auVar61._4_4_;
  auVar174._8_4_ = fVar226 * auVar61._8_4_;
  auVar174._12_4_ = fVar227 * auVar61._12_4_;
  auVar49 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar2,auVar49);
  auVar51 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar193);
  local_2d0 = vsubps_avx(_local_320,auVar121);
  uVar125 = local_2d0._0_4_;
  auVar194._4_4_ = uVar125;
  auVar194._0_4_ = uVar125;
  auVar194._8_4_ = uVar125;
  auVar194._12_4_ = uVar125;
  auVar49 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar61 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar217._0_4_ = auVar61._0_4_ * fVar120;
  auVar217._4_4_ = auVar61._4_4_ * fVar215;
  auVar217._8_4_ = auVar61._8_4_ * fVar226;
  auVar217._12_4_ = auVar61._12_4_ * fVar227;
  auVar49 = vfmadd231ps_fma(auVar217,(undefined1  [16])aVar2,auVar49);
  auVar126 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar194);
  local_2e0 = vsubps_avx512vl(_local_370,auVar121);
  uVar125 = local_2e0._0_4_;
  auVar195._4_4_ = uVar125;
  auVar195._0_4_ = uVar125;
  auVar195._8_4_ = uVar125;
  auVar195._12_4_ = uVar125;
  auVar49 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar61 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar230._0_4_ = auVar61._0_4_ * fVar120;
  auVar230._4_4_ = auVar61._4_4_ * fVar215;
  auVar230._8_4_ = auVar61._8_4_ * fVar226;
  auVar230._12_4_ = auVar61._12_4_ * fVar227;
  auVar49 = vfmadd231ps_fma(auVar230,(undefined1  [16])aVar2,auVar49);
  auVar50 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar195);
  local_2f0 = vsubps_avx512vl(_local_380,auVar121);
  uVar125 = local_2f0._0_4_;
  auVar196._4_4_ = uVar125;
  auVar196._0_4_ = uVar125;
  auVar196._8_4_ = uVar125;
  auVar196._12_4_ = uVar125;
  auVar49 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar61 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar237._0_4_ = auVar61._0_4_ * fVar120;
  auVar237._4_4_ = auVar61._4_4_ * fVar215;
  auVar237._8_4_ = auVar61._8_4_ * fVar226;
  auVar237._12_4_ = auVar61._12_4_ * fVar227;
  auVar49 = vfmadd231ps_fma(auVar237,(undefined1  [16])aVar2,auVar49);
  auVar52 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar196);
  local_300 = vsubps_avx(_local_340,auVar121);
  uVar125 = local_300._0_4_;
  auVar121._4_4_ = uVar125;
  auVar121._0_4_ = uVar125;
  auVar121._8_4_ = uVar125;
  auVar121._12_4_ = uVar125;
  auVar49 = vshufps_avx(local_300,local_300,0x55);
  auVar61 = vshufps_avx(local_300,local_300,0xaa);
  auVar74._0_4_ = auVar61._0_4_ * fVar120;
  auVar74._4_4_ = auVar61._4_4_ * fVar215;
  auVar74._8_4_ = auVar61._8_4_ * fVar226;
  auVar74._12_4_ = auVar61._12_4_ * fVar227;
  auVar49 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar2,auVar49);
  auVar121 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar1,auVar121);
  auVar60 = vmovlhps_avx(auVar56,auVar126);
  auVar59 = vmovlhps_avx(auVar55,auVar50);
  auVar57 = vmovlhps_avx512f(auVar54,auVar52);
  _local_420 = vmovlhps_avx512f(auVar51,auVar121);
  auVar61 = vminps_avx(auVar60,auVar59);
  auVar49 = vmaxps_avx(auVar60,auVar59);
  auVar58 = vminps_avx512vl(auVar57,_local_420);
  auVar61 = vminps_avx(auVar61,auVar58);
  auVar58 = vmaxps_avx512vl(auVar57,_local_420);
  auVar49 = vmaxps_avx(auVar49,auVar58);
  auVar58 = vshufpd_avx(auVar61,auVar61,3);
  auVar61 = vminps_avx(auVar61,auVar58);
  auVar58 = vshufpd_avx(auVar49,auVar49,3);
  auVar49 = vmaxps_avx(auVar49,auVar58);
  auVar61 = vandps_avx512vl(auVar61,auVar267._0_16_);
  auVar49 = vandps_avx512vl(auVar49,auVar267._0_16_);
  auVar49 = vmaxps_avx(auVar61,auVar49);
  auVar61 = vmovshdup_avx(auVar49);
  auVar49 = vmaxss_avx(auVar61,auVar49);
  local_400 = vmovddup_avx512vl(auVar56);
  local_410 = vmovddup_avx512vl(auVar55);
  auVar53._8_8_ = auVar54._0_8_;
  auVar53._0_8_ = auVar54._0_8_;
  auVar175._0_8_ = auVar51._0_8_;
  auVar175._8_8_ = auVar175._0_8_;
  local_430 = ZEXT416((uint)(auVar49._0_4_ * 9.536743e-07));
  local_1c0 = vbroadcastss_avx512vl(local_430);
  auVar49 = vxorps_avx512vl(local_1c0._0_16_,auVar268._0_16_);
  local_1e0 = vbroadcastss_avx512vl(auVar49);
  uVar42 = 0;
  auVar49 = vsubps_avx(auVar59,auVar60);
  auVar58 = vsubps_avx512vl(auVar57,auVar59);
  auVar56 = vsubps_avx512vl(_local_420,auVar57);
  local_390 = vsubps_avx(_local_320,local_310);
  local_3a0 = vsubps_avx512vl(_local_370,local_350);
  local_3b0 = vsubps_avx512vl(_local_380,local_360);
  _local_3c0 = vsubps_avx512vl(_local_340,local_330);
  local_220 = vpbroadcastd_avx512vl();
  local_240 = vpbroadcastd_avx512vl();
  auVar61 = ZEXT816(0x3f80000000000000);
  auVar265 = ZEXT1664(auVar61);
  do {
    auVar75 = auVar265._0_16_;
    auVar55 = vshufps_avx(auVar75,auVar75,0x50);
    auVar86 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar54 = vsubps_avx512vl(auVar86._0_16_,auVar55);
    fVar120 = auVar55._0_4_;
    fVar123 = auVar126._0_4_;
    auVar145._0_4_ = fVar123 * fVar120;
    fVar215 = auVar55._4_4_;
    fVar124 = auVar126._4_4_;
    auVar145._4_4_ = fVar124 * fVar215;
    fVar226 = auVar55._8_4_;
    auVar145._8_4_ = fVar123 * fVar226;
    fVar227 = auVar55._12_4_;
    auVar145._12_4_ = fVar124 * fVar227;
    fVar162 = auVar50._0_4_;
    auVar155._0_4_ = fVar162 * fVar120;
    fVar163 = auVar50._4_4_;
    auVar155._4_4_ = fVar163 * fVar215;
    auVar155._8_4_ = fVar162 * fVar226;
    auVar155._12_4_ = fVar163 * fVar227;
    fVar164 = auVar52._0_4_;
    auVar165._0_4_ = fVar164 * fVar120;
    fVar236 = auVar52._4_4_;
    auVar165._4_4_ = fVar236 * fVar215;
    auVar165._8_4_ = fVar164 * fVar226;
    auVar165._12_4_ = fVar236 * fVar227;
    fVar245 = auVar121._0_4_;
    auVar127._0_4_ = fVar245 * fVar120;
    fVar246 = auVar121._4_4_;
    auVar127._4_4_ = fVar246 * fVar215;
    auVar127._8_4_ = fVar245 * fVar226;
    auVar127._12_4_ = fVar246 * fVar227;
    auVar51 = vfmadd231ps_avx512vl(auVar145,auVar54,local_400);
    auVar62 = vfmadd231ps_avx512vl(auVar155,auVar54,local_410);
    auVar63 = vfmadd231ps_avx512vl(auVar165,auVar54,auVar53);
    auVar54 = vfmadd231ps_fma(auVar127,auVar175,auVar54);
    auVar55 = vmovshdup_avx(auVar61);
    fVar215 = auVar61._0_4_;
    fVar120 = (auVar55._0_4_ - fVar215) * 0.04761905;
    auVar191._4_4_ = fVar215;
    auVar191._0_4_ = fVar215;
    auVar191._8_4_ = fVar215;
    auVar191._12_4_ = fVar215;
    auVar191._16_4_ = fVar215;
    auVar191._20_4_ = fVar215;
    auVar191._24_4_ = fVar215;
    auVar191._28_4_ = fVar215;
    auVar140._0_8_ = auVar55._0_8_;
    auVar140._8_8_ = auVar140._0_8_;
    auVar140._16_8_ = auVar140._0_8_;
    auVar140._24_8_ = auVar140._0_8_;
    auVar81 = vsubps_avx(auVar140,auVar191);
    uVar125 = auVar51._0_4_;
    auVar141._4_4_ = uVar125;
    auVar141._0_4_ = uVar125;
    auVar141._8_4_ = uVar125;
    auVar141._12_4_ = uVar125;
    auVar141._16_4_ = uVar125;
    auVar141._20_4_ = uVar125;
    auVar141._24_4_ = uVar125;
    auVar141._28_4_ = uVar125;
    auVar212._8_4_ = 1;
    auVar212._0_8_ = 0x100000001;
    auVar212._12_4_ = 1;
    auVar212._16_4_ = 1;
    auVar212._20_4_ = 1;
    auVar212._24_4_ = 1;
    auVar212._28_4_ = 1;
    auVar95 = ZEXT1632(auVar51);
    auVar79 = vpermps_avx2(auVar212,auVar95);
    auVar87 = vbroadcastss_avx512vl(auVar62);
    auVar96 = ZEXT1632(auVar62);
    auVar88 = vpermps_avx512vl(auVar212,auVar96);
    auVar89 = vbroadcastss_avx512vl(auVar63);
    auVar80 = ZEXT1632(auVar63);
    auVar78 = vpermps_avx512vl(auVar212,auVar80);
    auVar90 = vbroadcastss_avx512vl(auVar54);
    auVar93 = ZEXT1632(auVar54);
    auVar91 = vpermps_avx512vl(auVar212,auVar93);
    auVar213._4_4_ = fVar120;
    auVar213._0_4_ = fVar120;
    auVar213._8_4_ = fVar120;
    auVar213._12_4_ = fVar120;
    auVar213._16_4_ = fVar120;
    auVar213._20_4_ = fVar120;
    auVar213._24_4_ = fVar120;
    auVar213._28_4_ = fVar120;
    auVar252._8_4_ = 2;
    auVar252._0_8_ = 0x200000002;
    auVar252._12_4_ = 2;
    auVar252._16_4_ = 2;
    auVar252._20_4_ = 2;
    auVar252._24_4_ = 2;
    auVar252._28_4_ = 2;
    auVar76 = vpermps_avx512vl(auVar252,auVar95);
    auVar179._8_4_ = 3;
    auVar179._0_8_ = 0x300000003;
    auVar179._12_4_ = 3;
    auVar179._16_4_ = 3;
    auVar179._20_4_ = 3;
    auVar179._24_4_ = 3;
    auVar179._28_4_ = 3;
    auVar77 = vpermps_avx512vl(auVar179,auVar95);
    auVar95 = vpermps_avx2(auVar252,auVar96);
    auVar96 = vpermps_avx2(auVar179,auVar96);
    auVar97 = vpermps_avx2(auVar252,auVar80);
    auVar80 = vpermps_avx2(auVar179,auVar80);
    auVar92 = vpermps_avx512vl(auVar252,auVar93);
    auVar93 = vpermps_avx512vl(auVar179,auVar93);
    auVar55 = vfmadd132ps_fma(auVar81,auVar191,_DAT_02020f20);
    auVar86 = vsubps_avx512vl(auVar86,ZEXT1632(auVar55));
    auVar81 = vmulps_avx512vl(auVar87,ZEXT1632(auVar55));
    auVar98 = ZEXT1632(auVar55);
    auVar94 = vmulps_avx512vl(auVar88,auVar98);
    auVar54 = vfmadd231ps_fma(auVar81,auVar86,auVar141);
    auVar51 = vfmadd231ps_fma(auVar94,auVar86,auVar79);
    auVar81 = vmulps_avx512vl(auVar89,auVar98);
    auVar94 = vmulps_avx512vl(auVar78,auVar98);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar86,auVar87);
    auVar87 = vfmadd231ps_avx512vl(auVar94,auVar86,auVar88);
    auVar88 = vmulps_avx512vl(auVar90,auVar98);
    auVar94 = ZEXT1632(auVar55);
    auVar91 = vmulps_avx512vl(auVar91,auVar94);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar86,auVar89);
    auVar89 = vfmadd231ps_avx512vl(auVar91,auVar86,auVar78);
    fVar226 = auVar55._0_4_;
    fVar227 = auVar55._4_4_;
    auVar22._4_4_ = fVar227 * auVar81._4_4_;
    auVar22._0_4_ = fVar226 * auVar81._0_4_;
    fVar228 = auVar55._8_4_;
    auVar22._8_4_ = fVar228 * auVar81._8_4_;
    fVar143 = auVar55._12_4_;
    auVar22._12_4_ = fVar143 * auVar81._12_4_;
    auVar22._16_4_ = auVar81._16_4_ * 0.0;
    auVar22._20_4_ = auVar81._20_4_ * 0.0;
    auVar22._24_4_ = auVar81._24_4_ * 0.0;
    auVar22._28_4_ = fVar215;
    auVar23._4_4_ = fVar227 * auVar87._4_4_;
    auVar23._0_4_ = fVar226 * auVar87._0_4_;
    auVar23._8_4_ = fVar228 * auVar87._8_4_;
    auVar23._12_4_ = fVar143 * auVar87._12_4_;
    auVar23._16_4_ = auVar87._16_4_ * 0.0;
    auVar23._20_4_ = auVar87._20_4_ * 0.0;
    auVar23._24_4_ = auVar87._24_4_ * 0.0;
    auVar23._28_4_ = auVar79._28_4_;
    auVar54 = vfmadd231ps_fma(auVar22,auVar86,ZEXT1632(auVar54));
    auVar51 = vfmadd231ps_fma(auVar23,auVar86,ZEXT1632(auVar51));
    auVar133._0_4_ = fVar226 * auVar88._0_4_;
    auVar133._4_4_ = fVar227 * auVar88._4_4_;
    auVar133._8_4_ = fVar228 * auVar88._8_4_;
    auVar133._12_4_ = fVar143 * auVar88._12_4_;
    auVar133._16_4_ = auVar88._16_4_ * 0.0;
    auVar133._20_4_ = auVar88._20_4_ * 0.0;
    auVar133._24_4_ = auVar88._24_4_ * 0.0;
    auVar133._28_4_ = 0;
    auVar24._4_4_ = fVar227 * auVar89._4_4_;
    auVar24._0_4_ = fVar226 * auVar89._0_4_;
    auVar24._8_4_ = fVar228 * auVar89._8_4_;
    auVar24._12_4_ = fVar143 * auVar89._12_4_;
    auVar24._16_4_ = auVar89._16_4_ * 0.0;
    auVar24._20_4_ = auVar89._20_4_ * 0.0;
    auVar24._24_4_ = auVar89._24_4_ * 0.0;
    auVar24._28_4_ = auVar88._28_4_;
    auVar62 = vfmadd231ps_fma(auVar133,auVar86,auVar81);
    auVar63 = vfmadd231ps_fma(auVar24,auVar86,auVar87);
    auVar25._28_4_ = auVar87._28_4_;
    auVar25._0_28_ =
         ZEXT1628(CONCAT412(fVar143 * auVar63._12_4_,
                            CONCAT48(fVar228 * auVar63._8_4_,
                                     CONCAT44(fVar227 * auVar63._4_4_,fVar226 * auVar63._0_4_))));
    auVar66 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar62._12_4_,
                                                 CONCAT48(fVar228 * auVar62._8_4_,
                                                          CONCAT44(fVar227 * auVar62._4_4_,
                                                                   fVar226 * auVar62._0_4_)))),
                              auVar86,ZEXT1632(auVar54));
    auVar64 = vfmadd231ps_fma(auVar25,auVar86,ZEXT1632(auVar51));
    auVar81 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar54));
    auVar79 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar51));
    auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar81 = vmulps_avx512vl(auVar81,auVar87);
    auVar79 = vmulps_avx512vl(auVar79,auVar87);
    auVar207._0_4_ = fVar120 * auVar81._0_4_;
    auVar207._4_4_ = fVar120 * auVar81._4_4_;
    auVar207._8_4_ = fVar120 * auVar81._8_4_;
    auVar207._12_4_ = fVar120 * auVar81._12_4_;
    auVar207._16_4_ = fVar120 * auVar81._16_4_;
    auVar207._20_4_ = fVar120 * auVar81._20_4_;
    auVar207._24_4_ = fVar120 * auVar81._24_4_;
    auVar207._28_4_ = 0;
    auVar81 = vmulps_avx512vl(auVar213,auVar79);
    auVar62 = vxorps_avx512vl(auVar90._0_16_,auVar90._0_16_);
    auVar88 = vpermt2ps_avx512vl(ZEXT1632(auVar66),_DAT_0205fd20,ZEXT1632(auVar62));
    auVar89 = vpermt2ps_avx512vl(ZEXT1632(auVar64),_DAT_0205fd20,ZEXT1632(auVar62));
    auVar134._0_4_ = auVar207._0_4_ + auVar66._0_4_;
    auVar134._4_4_ = auVar207._4_4_ + auVar66._4_4_;
    auVar134._8_4_ = auVar207._8_4_ + auVar66._8_4_;
    auVar134._12_4_ = auVar207._12_4_ + auVar66._12_4_;
    auVar134._16_4_ = auVar207._16_4_ + 0.0;
    auVar134._20_4_ = auVar207._20_4_ + 0.0;
    auVar134._24_4_ = auVar207._24_4_ + 0.0;
    auVar134._28_4_ = 0;
    auVar98 = ZEXT1632(auVar62);
    auVar79 = vpermt2ps_avx512vl(auVar207,_DAT_0205fd20,auVar98);
    auVar78 = vaddps_avx512vl(ZEXT1632(auVar64),auVar81);
    auVar90 = vpermt2ps_avx512vl(auVar81,_DAT_0205fd20,auVar98);
    auVar81 = vsubps_avx(auVar88,auVar79);
    auVar90 = vsubps_avx512vl(auVar89,auVar90);
    auVar79 = vmulps_avx512vl(auVar95,auVar94);
    auVar91 = vmulps_avx512vl(auVar96,auVar94);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar86,auVar76);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,auVar77);
    auVar76 = vmulps_avx512vl(auVar97,auVar94);
    auVar77 = vmulps_avx512vl(auVar80,auVar94);
    auVar95 = vfmadd231ps_avx512vl(auVar76,auVar86,auVar95);
    auVar96 = vfmadd231ps_avx512vl(auVar77,auVar86,auVar96);
    auVar76 = vmulps_avx512vl(auVar92,auVar94);
    auVar77 = vmulps_avx512vl(auVar93,auVar94);
    auVar54 = vfmadd231ps_fma(auVar76,auVar86,auVar97);
    auVar51 = vfmadd231ps_fma(auVar77,auVar86,auVar80);
    auVar76 = vmulps_avx512vl(auVar94,auVar95);
    auVar77 = vmulps_avx512vl(ZEXT1632(auVar55),auVar96);
    auVar79 = vfmadd231ps_avx512vl(auVar76,auVar86,auVar79);
    auVar91 = vfmadd231ps_avx512vl(auVar77,auVar86,auVar91);
    auVar95 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar143 * auVar54._12_4_,
                                            CONCAT48(fVar228 * auVar54._8_4_,
                                                     CONCAT44(fVar227 * auVar54._4_4_,
                                                              fVar226 * auVar54._0_4_)))),auVar86,
                         auVar95);
    auVar96 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar143 * auVar51._12_4_,
                                            CONCAT48(fVar228 * auVar51._8_4_,
                                                     CONCAT44(fVar227 * auVar51._4_4_,
                                                              fVar226 * auVar51._0_4_)))),auVar86,
                         auVar96);
    auVar26._4_4_ = fVar227 * auVar95._4_4_;
    auVar26._0_4_ = fVar226 * auVar95._0_4_;
    auVar26._8_4_ = fVar228 * auVar95._8_4_;
    auVar26._12_4_ = fVar143 * auVar95._12_4_;
    auVar26._16_4_ = auVar95._16_4_ * 0.0;
    auVar26._20_4_ = auVar95._20_4_ * 0.0;
    auVar26._24_4_ = auVar95._24_4_ * 0.0;
    auVar26._28_4_ = auVar80._28_4_;
    auVar27._4_4_ = fVar227 * auVar96._4_4_;
    auVar27._0_4_ = fVar226 * auVar96._0_4_;
    auVar27._8_4_ = fVar228 * auVar96._8_4_;
    auVar27._12_4_ = fVar143 * auVar96._12_4_;
    auVar27._16_4_ = auVar96._16_4_ * 0.0;
    auVar27._20_4_ = auVar96._20_4_ * 0.0;
    auVar27._24_4_ = auVar96._24_4_ * 0.0;
    auVar27._28_4_ = auVar97._28_4_;
    auVar97 = vfmadd231ps_avx512vl(auVar26,auVar86,auVar79);
    auVar80 = vfmadd231ps_avx512vl(auVar27,auVar91,auVar86);
    auVar79 = vsubps_avx512vl(auVar95,auVar79);
    auVar95 = vsubps_avx512vl(auVar96,auVar91);
    auVar79 = vmulps_avx512vl(auVar79,auVar87);
    auVar95 = vmulps_avx512vl(auVar95,auVar87);
    fVar215 = fVar120 * auVar79._0_4_;
    fVar226 = fVar120 * auVar79._4_4_;
    auVar28._4_4_ = fVar226;
    auVar28._0_4_ = fVar215;
    fVar227 = fVar120 * auVar79._8_4_;
    auVar28._8_4_ = fVar227;
    fVar228 = fVar120 * auVar79._12_4_;
    auVar28._12_4_ = fVar228;
    fVar143 = fVar120 * auVar79._16_4_;
    auVar28._16_4_ = fVar143;
    fVar229 = fVar120 * auVar79._20_4_;
    auVar28._20_4_ = fVar229;
    fVar120 = fVar120 * auVar79._24_4_;
    auVar28._24_4_ = fVar120;
    auVar28._28_4_ = auVar79._28_4_;
    auVar95 = vmulps_avx512vl(auVar213,auVar95);
    auVar96 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,auVar98);
    auVar86 = vpermt2ps_avx512vl(auVar80,_DAT_0205fd20,auVar98);
    auVar214._0_4_ = auVar97._0_4_ + fVar215;
    auVar214._4_4_ = auVar97._4_4_ + fVar226;
    auVar214._8_4_ = auVar97._8_4_ + fVar227;
    auVar214._12_4_ = auVar97._12_4_ + fVar228;
    auVar214._16_4_ = auVar97._16_4_ + fVar143;
    auVar214._20_4_ = auVar97._20_4_ + fVar229;
    auVar214._24_4_ = auVar97._24_4_ + fVar120;
    auVar214._28_4_ = auVar97._28_4_ + auVar79._28_4_;
    auVar79 = vpermt2ps_avx512vl(auVar28,_DAT_0205fd20,ZEXT1632(auVar62));
    auVar87 = vaddps_avx512vl(auVar80,auVar95);
    auVar95 = vpermt2ps_avx512vl(auVar95,_DAT_0205fd20,ZEXT1632(auVar62));
    auVar79 = vsubps_avx(auVar96,auVar79);
    auVar95 = vsubps_avx512vl(auVar86,auVar95);
    auVar152 = ZEXT1632(auVar66);
    auVar91 = vsubps_avx512vl(auVar97,auVar152);
    auVar159 = ZEXT1632(auVar64);
    auVar76 = vsubps_avx512vl(auVar80,auVar159);
    auVar77 = vsubps_avx512vl(auVar96,auVar88);
    auVar91 = vaddps_avx512vl(auVar91,auVar77);
    auVar77 = vsubps_avx512vl(auVar86,auVar89);
    auVar76 = vaddps_avx512vl(auVar76,auVar77);
    auVar77 = vmulps_avx512vl(auVar159,auVar91);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar152,auVar76);
    auVar92 = vmulps_avx512vl(auVar78,auVar91);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar134,auVar76);
    auVar93 = vmulps_avx512vl(auVar90,auVar91);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar81,auVar76);
    auVar94 = vmulps_avx512vl(auVar89,auVar91);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar88,auVar76);
    auVar98 = vmulps_avx512vl(auVar80,auVar91);
    auVar98 = vfnmadd231ps_avx512vl(auVar98,auVar97,auVar76);
    auVar99 = vmulps_avx512vl(auVar87,auVar91);
    auVar99 = vfnmadd231ps_avx512vl(auVar99,auVar214,auVar76);
    auVar100 = vmulps_avx512vl(auVar95,auVar91);
    auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar79,auVar76);
    auVar91 = vmulps_avx512vl(auVar86,auVar91);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar96,auVar76);
    auVar76 = vminps_avx512vl(auVar77,auVar92);
    auVar77 = vmaxps_avx512vl(auVar77,auVar92);
    auVar92 = vminps_avx512vl(auVar93,auVar94);
    auVar76 = vminps_avx512vl(auVar76,auVar92);
    auVar92 = vmaxps_avx512vl(auVar93,auVar94);
    auVar77 = vmaxps_avx512vl(auVar77,auVar92);
    auVar92 = vminps_avx512vl(auVar98,auVar99);
    auVar93 = vmaxps_avx512vl(auVar98,auVar99);
    auVar94 = vminps_avx512vl(auVar100,auVar91);
    auVar92 = vminps_avx512vl(auVar92,auVar94);
    auVar76 = vminps_avx512vl(auVar76,auVar92);
    auVar91 = vmaxps_avx512vl(auVar100,auVar91);
    auVar91 = vmaxps_avx512vl(auVar93,auVar91);
    auVar91 = vmaxps_avx512vl(auVar77,auVar91);
    uVar18 = vcmpps_avx512vl(auVar76,local_1c0,2);
    uVar19 = vcmpps_avx512vl(auVar91,local_1e0,5);
    uVar118 = 0;
    bVar40 = (byte)uVar18 & (byte)uVar19 & 0x7f;
    if (bVar40 != 0) {
      auVar91 = vsubps_avx512vl(auVar88,auVar152);
      auVar76 = vsubps_avx512vl(auVar89,auVar159);
      auVar77 = vsubps_avx512vl(auVar96,auVar97);
      auVar91 = vaddps_avx512vl(auVar91,auVar77);
      auVar77 = vsubps_avx512vl(auVar86,auVar80);
      auVar76 = vaddps_avx512vl(auVar76,auVar77);
      auVar77 = vmulps_avx512vl(auVar159,auVar91);
      auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar76,auVar152);
      auVar78 = vmulps_avx512vl(auVar78,auVar91);
      auVar78 = vfnmadd213ps_avx512vl(auVar134,auVar76,auVar78);
      auVar90 = vmulps_avx512vl(auVar90,auVar91);
      auVar90 = vfnmadd213ps_avx512vl(auVar81,auVar76,auVar90);
      auVar81 = vmulps_avx512vl(auVar89,auVar91);
      auVar88 = vfnmadd231ps_avx512vl(auVar81,auVar76,auVar88);
      auVar81 = vmulps_avx512vl(auVar80,auVar91);
      auVar97 = vfnmadd231ps_avx512vl(auVar81,auVar76,auVar97);
      auVar81 = vmulps_avx512vl(auVar87,auVar91);
      auVar80 = vfnmadd213ps_avx512vl(auVar214,auVar76,auVar81);
      auVar81 = vmulps_avx512vl(auVar95,auVar91);
      auVar87 = vfnmadd213ps_avx512vl(auVar79,auVar76,auVar81);
      auVar81 = vmulps_avx512vl(auVar86,auVar91);
      auVar86 = vfnmadd231ps_avx512vl(auVar81,auVar96,auVar76);
      auVar79 = vminps_avx(auVar77,auVar78);
      auVar81 = vmaxps_avx(auVar77,auVar78);
      auVar95 = vminps_avx(auVar90,auVar88);
      auVar95 = vminps_avx(auVar79,auVar95);
      auVar79 = vmaxps_avx(auVar90,auVar88);
      auVar81 = vmaxps_avx(auVar81,auVar79);
      auVar96 = vminps_avx(auVar97,auVar80);
      auVar79 = vmaxps_avx(auVar97,auVar80);
      auVar97 = vminps_avx(auVar87,auVar86);
      auVar96 = vminps_avx(auVar96,auVar97);
      auVar96 = vminps_avx(auVar95,auVar96);
      auVar95 = vmaxps_avx(auVar87,auVar86);
      auVar79 = vmaxps_avx(auVar79,auVar95);
      auVar81 = vmaxps_avx(auVar81,auVar79);
      uVar18 = vcmpps_avx512vl(auVar81,local_1e0,5);
      uVar19 = vcmpps_avx512vl(auVar96,local_1c0,2);
      uVar118 = (uint)(bVar40 & (byte)uVar18 & (byte)uVar19);
    }
    if (uVar118 != 0) {
      auStack_3f0[uVar42] = uVar118;
      uVar18 = vmovlps_avx(auVar61);
      *(undefined8 *)(&uStack_280 + uVar42 * 2) = uVar18;
      uVar46 = vmovlps_avx512f(auVar75);
      auStack_1a0[uVar42] = uVar46;
      uVar42 = (ulong)((int)uVar42 + 1);
    }
    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar266 = ZEXT1664(auVar61);
    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar267 = ZEXT1664(auVar61);
    auVar61 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar268 = ZEXT1664(auVar61);
    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar269 = ZEXT3264(auVar81);
    auVar270 = ZEXT464(0x3f800000);
    auVar61 = auVar81._16_16_;
    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar271 = ZEXT1664(auVar55);
    do {
      auVar55 = auVar274._0_16_;
      if ((int)uVar42 == 0) {
        uVar125 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar21._4_4_ = uVar125;
        auVar21._0_4_ = uVar125;
        auVar21._8_4_ = uVar125;
        auVar21._12_4_ = uVar125;
        auVar21._16_4_ = uVar125;
        auVar21._20_4_ = uVar125;
        auVar21._24_4_ = uVar125;
        auVar21._28_4_ = uVar125;
        uVar18 = vcmpps_avx512vl(local_200,auVar21,2);
        uVar47 = (uint)uVar48 & (uint)uVar18;
        uVar48 = (ulong)uVar47;
        if (uVar47 == 0) {
          return;
        }
        goto LAB_01d66369;
      }
      uVar41 = (int)uVar42 - 1;
      uVar43 = (ulong)uVar41;
      uVar118 = (&uStack_280)[uVar43 * 2];
      fVar120 = afStack_27c[uVar43 * 2];
      uVar5 = auStack_3f0[uVar43];
      auVar263._8_8_ = 0;
      auVar263._0_8_ = auStack_1a0[uVar43];
      auVar265 = ZEXT1664(auVar263);
      lVar45 = 0;
      for (uVar46 = (ulong)uVar5; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
        lVar45 = lVar45 + 1;
      }
      uVar44 = uVar5 - 1 & uVar5;
      auStack_3f0[uVar43] = uVar44;
      if (uVar44 == 0) {
        uVar42 = (ulong)uVar41;
      }
      auVar135._0_4_ = (float)lVar45;
      auVar135._4_8_ = SUB128(ZEXT812(0),4);
      auVar135._12_4_ = 0;
      auVar61 = vmulss_avx512f(auVar135,SUB6416(ZEXT464(0x3e124925),0));
      lVar45 = lVar45 + 1;
      auVar54 = vmulss_avx512f(ZEXT416((uint)(float)lVar45),SUB6416(ZEXT464(0x3e124925),0));
      auVar63 = auVar270._0_16_;
      auVar51 = vsubss_avx512f(auVar63,auVar61);
      auVar61 = vmulss_avx512f(ZEXT416((uint)fVar120),auVar61);
      auVar51 = vfmadd231ss_avx512f(auVar61,ZEXT416(uVar118),auVar51);
      auVar61 = vsubss_avx512f(auVar63,auVar54);
      auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar120 * auVar54._0_4_)),ZEXT416(uVar118),auVar61);
      auVar62 = vsubss_avx512f(auVar54,auVar51);
      vucomiss_avx512f(auVar62);
      if (uVar5 == 0 || lVar45 == 0) break;
      auVar61 = vshufps_avx(auVar263,auVar263,0x50);
      vucomiss_avx512f(auVar62);
      auVar181 = auVar271._0_16_;
      auVar64 = vsubps_avx512vl(auVar181,auVar61);
      fVar120 = auVar61._0_4_;
      auVar146._0_4_ = fVar123 * fVar120;
      fVar215 = auVar61._4_4_;
      auVar146._4_4_ = fVar124 * fVar215;
      fVar226 = auVar61._8_4_;
      auVar146._8_4_ = fVar123 * fVar226;
      fVar227 = auVar61._12_4_;
      auVar146._12_4_ = fVar124 * fVar227;
      auVar156._0_4_ = fVar162 * fVar120;
      auVar156._4_4_ = fVar163 * fVar215;
      auVar156._8_4_ = fVar162 * fVar226;
      auVar156._12_4_ = fVar163 * fVar227;
      auVar166._0_4_ = fVar164 * fVar120;
      auVar166._4_4_ = fVar236 * fVar215;
      auVar166._8_4_ = fVar164 * fVar226;
      auVar166._12_4_ = fVar236 * fVar227;
      auVar128._0_4_ = fVar245 * fVar120;
      auVar128._4_4_ = fVar246 * fVar215;
      auVar128._8_4_ = fVar245 * fVar226;
      auVar128._12_4_ = fVar246 * fVar227;
      auVar61 = vfmadd231ps_fma(auVar146,auVar64,local_400);
      auVar66 = vfmadd231ps_fma(auVar156,auVar64,local_410);
      auVar65 = vfmadd231ps_avx512vl(auVar166,auVar64,auVar53);
      auVar64 = vfmadd231ps_fma(auVar128,auVar175,auVar64);
      auVar142._16_16_ = auVar61;
      auVar142._0_16_ = auVar61;
      auVar153._16_16_ = auVar66;
      auVar153._0_16_ = auVar66;
      auVar160._16_16_ = auVar65;
      auVar160._0_16_ = auVar65;
      uVar125 = auVar51._0_4_;
      auVar180._4_4_ = uVar125;
      auVar180._0_4_ = uVar125;
      auVar180._8_4_ = uVar125;
      auVar180._12_4_ = uVar125;
      uVar125 = auVar54._0_4_;
      auVar180._20_4_ = uVar125;
      auVar180._16_4_ = uVar125;
      auVar180._24_4_ = uVar125;
      auVar180._28_4_ = uVar125;
      auVar81 = vsubps_avx(auVar153,auVar142);
      auVar66 = vfmadd213ps_fma(auVar81,auVar180,auVar142);
      auVar81 = vsubps_avx(auVar160,auVar153);
      auVar75 = vfmadd213ps_fma(auVar81,auVar180,auVar153);
      auVar61 = vsubps_avx(auVar64,auVar65);
      auVar154._16_16_ = auVar61;
      auVar154._0_16_ = auVar61;
      auVar61 = vfmadd213ps_fma(auVar154,auVar180,auVar160);
      auVar81 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar66));
      auVar66 = vfmadd213ps_fma(auVar81,auVar180,ZEXT1632(auVar66));
      auVar81 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar75));
      auVar61 = vfmadd213ps_fma(auVar81,auVar180,ZEXT1632(auVar75));
      auVar81 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar66));
      auVar174 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar81,auVar180);
      auVar81 = vmulps_avx512vl(auVar81,auVar269._0_32_);
      auVar61 = auVar81._16_16_;
      fVar120 = auVar62._0_4_ * 0.33333334;
      auVar167._0_8_ =
           CONCAT44(auVar174._4_4_ + fVar120 * auVar81._4_4_,
                    auVar174._0_4_ + fVar120 * auVar81._0_4_);
      auVar167._8_4_ = auVar174._8_4_ + fVar120 * auVar81._8_4_;
      auVar167._12_4_ = auVar174._12_4_ + fVar120 * auVar81._12_4_;
      auVar147._0_4_ = fVar120 * auVar81._16_4_;
      auVar147._4_4_ = fVar120 * auVar81._20_4_;
      auVar147._8_4_ = fVar120 * auVar81._24_4_;
      auVar147._12_4_ = fVar120 * auVar81._28_4_;
      auVar172 = vsubps_avx((undefined1  [16])0x0,auVar147);
      auVar73 = vshufpd_avx(auVar174,auVar174,3);
      auVar70 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar66 = vsubps_avx(auVar73,auVar174);
      auVar64 = vsubps_avx(auVar70,(undefined1  [16])0x0);
      auVar182._0_4_ = auVar64._0_4_ + auVar66._0_4_;
      auVar182._4_4_ = auVar64._4_4_ + auVar66._4_4_;
      auVar182._8_4_ = auVar64._8_4_ + auVar66._8_4_;
      auVar182._12_4_ = auVar64._12_4_ + auVar66._12_4_;
      auVar66 = vshufps_avx(auVar174,auVar174,0xb1);
      auVar64 = vshufps_avx(auVar167,auVar167,0xb1);
      auVar75 = vshufps_avx(auVar172,auVar172,0xb1);
      auVar65 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar238._4_4_ = auVar182._0_4_;
      auVar238._0_4_ = auVar182._0_4_;
      auVar238._8_4_ = auVar182._0_4_;
      auVar238._12_4_ = auVar182._0_4_;
      auVar71 = vshufps_avx(auVar182,auVar182,0x55);
      fVar120 = auVar71._0_4_;
      auVar197._0_4_ = auVar66._0_4_ * fVar120;
      fVar215 = auVar71._4_4_;
      auVar197._4_4_ = auVar66._4_4_ * fVar215;
      fVar226 = auVar71._8_4_;
      auVar197._8_4_ = auVar66._8_4_ * fVar226;
      fVar227 = auVar71._12_4_;
      auVar197._12_4_ = auVar66._12_4_ * fVar227;
      auVar210._0_4_ = auVar64._0_4_ * fVar120;
      auVar210._4_4_ = auVar64._4_4_ * fVar215;
      auVar210._8_4_ = auVar64._8_4_ * fVar226;
      auVar210._12_4_ = auVar64._12_4_ * fVar227;
      auVar218._0_4_ = auVar75._0_4_ * fVar120;
      auVar218._4_4_ = auVar75._4_4_ * fVar215;
      auVar218._8_4_ = auVar75._8_4_ * fVar226;
      auVar218._12_4_ = auVar75._12_4_ * fVar227;
      auVar183._0_4_ = auVar65._0_4_ * fVar120;
      auVar183._4_4_ = auVar65._4_4_ * fVar215;
      auVar183._8_4_ = auVar65._8_4_ * fVar226;
      auVar183._12_4_ = auVar65._12_4_ * fVar227;
      auVar66 = vfmadd231ps_fma(auVar197,auVar238,auVar174);
      auVar64 = vfmadd231ps_fma(auVar210,auVar238,auVar167);
      auVar71 = vfmadd231ps_fma(auVar218,auVar238,auVar172);
      auVar173 = vfmadd231ps_fma(auVar183,(undefined1  [16])0x0,auVar238);
      auVar72 = vshufpd_avx(auVar66,auVar66,1);
      auVar67 = vshufpd_avx(auVar64,auVar64,1);
      auVar68 = vshufpd_avx(auVar71,auVar71,1);
      auVar69 = vshufpd_avx(auVar173,auVar173,1);
      auVar75 = vminss_avx(auVar66,auVar64);
      auVar66 = vmaxss_avx(auVar64,auVar66);
      auVar65 = vminss_avx(auVar71,auVar173);
      auVar64 = vmaxss_avx(auVar173,auVar71);
      auVar65 = vminss_avx(auVar75,auVar65);
      auVar66 = vmaxss_avx(auVar64,auVar66);
      auVar71 = vminss_avx(auVar72,auVar67);
      auVar64 = vmaxss_avx(auVar67,auVar72);
      auVar72 = vminss_avx(auVar68,auVar69);
      auVar75 = vmaxss_avx(auVar69,auVar68);
      auVar71 = vminss_avx(auVar71,auVar72);
      auVar64 = vmaxss_avx(auVar75,auVar64);
      fVar226 = auVar65._0_4_;
      fVar215 = auVar64._0_4_;
      fVar120 = auVar66._0_4_;
      if ((0.0001 <= fVar226) || (fVar215 <= -0.0001)) {
        uVar18 = vcmpps_avx512vl(auVar71,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar19 = vcmpps_avx512vl(auVar65,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar120 & ((byte)uVar19 | (byte)uVar18)) != 0) goto LAB_01d672d1;
        uVar18 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar64,5);
        uVar19 = vcmpps_avx512vl(auVar71,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar19 | (ushort)uVar18) & 1) == 0) goto LAB_01d672d1;
        bVar10 = true;
        auVar265 = ZEXT1664(auVar263);
      }
      else {
LAB_01d672d1:
        auVar67 = auVar273._0_16_;
        uVar18 = vcmpss_avx512f(auVar65,auVar67,1);
        bVar10 = (bool)((byte)uVar18 & 1);
        iVar119 = auVar270._0_4_;
        fVar227 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar119);
        uVar18 = vcmpss_avx512f(auVar66,auVar67,1);
        bVar10 = (bool)((byte)uVar18 & 1);
        fVar228 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar119);
        bVar10 = fVar227 != fVar228;
        iVar272 = auVar273._0_4_;
        auVar102._16_16_ = auVar61;
        auVar102._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar101._4_28_ = auVar102._4_28_;
        auVar101._0_4_ = (uint)bVar10 * iVar272 + (uint)!bVar10 * 0x7f800000;
        auVar72 = auVar101._0_16_;
        auVar104._16_16_ = auVar61;
        auVar104._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar103._4_28_ = auVar104._4_28_;
        auVar103._0_4_ = (uint)bVar10 * iVar272 + (uint)!bVar10 * -0x800000;
        auVar75 = auVar103._0_16_;
        uVar18 = vcmpss_avx512f(auVar71,auVar67,1);
        bVar10 = (bool)((byte)uVar18 & 1);
        fVar143 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar119);
        if ((fVar227 != fVar143) || (NAN(fVar227) || NAN(fVar143))) {
          fVar227 = auVar71._0_4_;
          bVar10 = fVar227 == fVar226;
          if ((!bVar10) || (NAN(fVar227) || NAN(fVar226))) {
            auVar65 = vxorps_avx512vl(auVar65,auVar268._0_16_);
            auVar257._0_4_ = auVar65._0_4_ / (fVar227 - fVar226);
            auVar257._4_12_ = auVar65._4_12_;
            auVar65 = vsubss_avx512f(auVar63,auVar257);
            auVar71 = vfmadd213ss_avx512f(auVar65,auVar67,auVar257);
            auVar65 = auVar71;
          }
          else {
            vucomiss_avx512f(auVar67);
            auVar106._16_16_ = auVar61;
            auVar106._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar105._4_28_ = auVar106._4_28_;
            auVar105._0_4_ = (uint)bVar10 * iVar272 + (uint)!bVar10 * 0x7f800000;
            auVar71 = auVar105._0_16_;
            auVar65 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar72 = vminss_avx(auVar72,auVar71);
          auVar75 = vmaxss_avx(auVar65,auVar75);
        }
        auVar265 = ZEXT1664(auVar263);
        uVar18 = vcmpss_avx512f(auVar64,auVar67,1);
        bVar10 = (bool)((byte)uVar18 & 1);
        fVar226 = (float)((uint)bVar10 * -0x40800000 + (uint)!bVar10 * iVar119);
        if ((fVar228 != fVar226) || (NAN(fVar228) || NAN(fVar226))) {
          bVar10 = fVar215 == fVar120;
          if ((!bVar10) || (NAN(fVar215) || NAN(fVar120))) {
            auVar66 = vxorps_avx512vl(auVar66,auVar268._0_16_);
            auVar219._0_4_ = auVar66._0_4_ / (fVar215 - fVar120);
            auVar219._4_12_ = auVar66._4_12_;
            auVar66 = vsubss_avx512f(auVar63,auVar219);
            auVar64 = vfmadd213ss_avx512f(auVar66,auVar67,auVar219);
            auVar66 = auVar64;
          }
          else {
            vucomiss_avx512f(auVar67);
            auVar108._16_16_ = auVar61;
            auVar108._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar107._4_28_ = auVar108._4_28_;
            auVar107._0_4_ = (uint)bVar10 * iVar272 + (uint)!bVar10 * 0x7f800000;
            auVar64 = auVar107._0_16_;
            auVar66 = ZEXT416((uint)bVar10 * 0x3f800000 + (uint)!bVar10 * -0x800000);
          }
          auVar72 = vminss_avx(auVar72,auVar64);
          auVar75 = vmaxss_avx(auVar66,auVar75);
        }
        bVar10 = fVar143 != fVar226;
        auVar66 = vminss_avx512f(auVar72,auVar63);
        auVar110._16_16_ = auVar61;
        auVar110._0_16_ = auVar72;
        auVar109._4_28_ = auVar110._4_28_;
        auVar109._0_4_ = (uint)bVar10 * auVar66._0_4_ + (uint)!bVar10 * auVar72._0_4_;
        auVar66 = vmaxss_avx512f(auVar63,auVar75);
        auVar112._16_16_ = auVar61;
        auVar112._0_16_ = auVar75;
        auVar111._4_28_ = auVar112._4_28_;
        auVar111._0_4_ = (uint)bVar10 * auVar66._0_4_ + (uint)!bVar10 * auVar75._0_4_;
        auVar66 = vmaxss_avx512f(auVar67,auVar109._0_16_);
        auVar64 = vminss_avx512f(auVar111._0_16_,auVar63);
        bVar10 = true;
        if (auVar66._0_4_ <= auVar64._0_4_) {
          auVar67 = vmaxss_avx512f(auVar67,ZEXT416((uint)(auVar66._0_4_ + -0.1)));
          auVar68 = vminss_avx512f(ZEXT416((uint)(auVar64._0_4_ + 0.1)),auVar63);
          auVar129._0_8_ = auVar174._0_8_;
          auVar129._8_8_ = auVar129._0_8_;
          auVar211._8_8_ = auVar167._0_8_;
          auVar211._0_8_ = auVar167._0_8_;
          auVar220._8_8_ = auVar172._0_8_;
          auVar220._0_8_ = auVar172._0_8_;
          auVar66 = vshufpd_avx(auVar167,auVar167,3);
          auVar64 = vshufpd_avx(auVar172,auVar172,3);
          auVar75 = vshufps_avx(auVar67,auVar68,0);
          auVar69 = vsubps_avx512vl(auVar181,auVar75);
          fVar120 = auVar75._0_4_;
          auVar249._0_4_ = fVar120 * auVar73._0_4_;
          fVar215 = auVar75._4_4_;
          auVar249._4_4_ = fVar215 * auVar73._4_4_;
          fVar226 = auVar75._8_4_;
          auVar249._8_4_ = fVar226 * auVar73._8_4_;
          fVar227 = auVar75._12_4_;
          auVar249._12_4_ = fVar227 * auVar73._12_4_;
          auVar168._0_4_ = fVar120 * auVar66._0_4_;
          auVar168._4_4_ = fVar215 * auVar66._4_4_;
          auVar168._8_4_ = fVar226 * auVar66._8_4_;
          auVar168._12_4_ = fVar227 * auVar66._12_4_;
          auVar176._0_4_ = fVar120 * auVar64._0_4_;
          auVar176._4_4_ = fVar215 * auVar64._4_4_;
          auVar176._8_4_ = fVar226 * auVar64._8_4_;
          auVar176._12_4_ = fVar227 * auVar64._12_4_;
          auVar148._0_4_ = fVar120 * auVar70._0_4_;
          auVar148._4_4_ = fVar215 * auVar70._4_4_;
          auVar148._8_4_ = fVar226 * auVar70._8_4_;
          auVar148._12_4_ = fVar227 * auVar70._12_4_;
          auVar65 = vfmadd231ps_fma(auVar249,auVar69,auVar129);
          auVar71 = vfmadd231ps_fma(auVar168,auVar69,auVar211);
          auVar72 = vfmadd231ps_fma(auVar176,auVar69,auVar220);
          auVar73 = vfmadd231ps_fma(auVar148,auVar69,ZEXT816(0));
          auVar64 = vsubss_avx512f(auVar63,auVar67);
          auVar66 = vmovshdup_avx(auVar263);
          auVar173 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar67._0_4_)),auVar263,auVar64
                                    );
          auVar64 = vsubss_avx512f(auVar63,auVar68);
          auVar174 = vfmadd231ss_fma(ZEXT416((uint)(auVar68._0_4_ * auVar66._0_4_)),auVar263,auVar64
                                    );
          auVar70 = vdivss_avx512f(auVar63,auVar62);
          auVar62 = vsubps_avx(auVar71,auVar65);
          auVar136._0_4_ = auVar62._0_4_ * 3.0;
          auVar136._4_4_ = auVar62._4_4_ * 3.0;
          auVar136._8_4_ = auVar62._8_4_ * 3.0;
          auVar136._12_4_ = auVar62._12_4_ * 3.0;
          auVar62 = vsubps_avx(auVar72,auVar71);
          auVar184._0_4_ = auVar62._0_4_ * 3.0;
          auVar184._4_4_ = auVar62._4_4_ * 3.0;
          auVar184._8_4_ = auVar62._8_4_ * 3.0;
          auVar184._12_4_ = auVar62._12_4_ * 3.0;
          auVar62 = vsubps_avx(auVar73,auVar72);
          auVar198._0_4_ = auVar62._0_4_ * 3.0;
          auVar198._4_4_ = auVar62._4_4_ * 3.0;
          auVar198._8_4_ = auVar62._8_4_ * 3.0;
          auVar198._12_4_ = auVar62._12_4_ * 3.0;
          auVar66 = vminps_avx(auVar184,auVar198);
          auVar62 = vmaxps_avx(auVar184,auVar198);
          auVar66 = vminps_avx(auVar136,auVar66);
          auVar62 = vmaxps_avx(auVar136,auVar62);
          auVar64 = vshufpd_avx(auVar66,auVar66,3);
          auVar75 = vshufpd_avx(auVar62,auVar62,3);
          auVar66 = vminps_avx(auVar66,auVar64);
          auVar62 = vmaxps_avx(auVar62,auVar75);
          fVar120 = auVar70._0_4_;
          auVar199._0_4_ = fVar120 * auVar66._0_4_;
          auVar199._4_4_ = fVar120 * auVar66._4_4_;
          auVar199._8_4_ = fVar120 * auVar66._8_4_;
          auVar199._12_4_ = fVar120 * auVar66._12_4_;
          auVar185._0_4_ = fVar120 * auVar62._0_4_;
          auVar185._4_4_ = fVar120 * auVar62._4_4_;
          auVar185._8_4_ = fVar120 * auVar62._8_4_;
          auVar185._12_4_ = fVar120 * auVar62._12_4_;
          auVar70 = vdivss_avx512f(auVar63,ZEXT416((uint)(auVar174._0_4_ - auVar173._0_4_)));
          auVar62 = vshufpd_avx(auVar65,auVar65,3);
          auVar66 = vshufpd_avx(auVar71,auVar71,3);
          auVar64 = vshufpd_avx(auVar72,auVar72,3);
          auVar75 = vshufpd_avx(auVar73,auVar73,3);
          auVar62 = vsubps_avx(auVar62,auVar65);
          auVar65 = vsubps_avx(auVar66,auVar71);
          auVar71 = vsubps_avx(auVar64,auVar72);
          auVar75 = vsubps_avx(auVar75,auVar73);
          auVar66 = vminps_avx(auVar62,auVar65);
          auVar62 = vmaxps_avx(auVar62,auVar65);
          auVar64 = vminps_avx(auVar71,auVar75);
          auVar64 = vminps_avx(auVar66,auVar64);
          auVar66 = vmaxps_avx(auVar71,auVar75);
          auVar62 = vmaxps_avx(auVar62,auVar66);
          fVar120 = auVar70._0_4_;
          auVar221._0_4_ = fVar120 * auVar64._0_4_;
          auVar221._4_4_ = fVar120 * auVar64._4_4_;
          auVar221._8_4_ = fVar120 * auVar64._8_4_;
          auVar221._12_4_ = fVar120 * auVar64._12_4_;
          auVar231._0_4_ = fVar120 * auVar62._0_4_;
          auVar231._4_4_ = fVar120 * auVar62._4_4_;
          auVar231._8_4_ = fVar120 * auVar62._8_4_;
          auVar231._12_4_ = fVar120 * auVar62._12_4_;
          auVar172 = vinsertps_avx512f(auVar51,auVar173,0x10);
          auVar65 = vinsertps_avx(auVar54,auVar174,0x10);
          auVar122._0_4_ = auVar172._0_4_ + auVar65._0_4_;
          auVar122._4_4_ = auVar172._4_4_ + auVar65._4_4_;
          auVar122._8_4_ = auVar172._8_4_ + auVar65._8_4_;
          auVar122._12_4_ = auVar172._12_4_ + auVar65._12_4_;
          auVar68 = vmulps_avx512vl(auVar122,auVar266._0_16_);
          auVar64 = vshufps_avx(auVar68,auVar68,0x54);
          uVar125 = auVar68._0_4_;
          auVar137._4_4_ = uVar125;
          auVar137._0_4_ = uVar125;
          auVar137._8_4_ = uVar125;
          auVar137._12_4_ = uVar125;
          auVar71 = vfmadd213ps_avx512vl(auVar49,auVar137,auVar60);
          auVar66 = vfmadd213ps_fma(auVar58,auVar137,auVar59);
          auVar75 = vfmadd213ps_fma(auVar56,auVar137,auVar57);
          auVar62 = vsubps_avx(auVar66,auVar71);
          auVar71 = vfmadd213ps_fma(auVar62,auVar137,auVar71);
          auVar62 = vsubps_avx(auVar75,auVar66);
          auVar62 = vfmadd213ps_fma(auVar62,auVar137,auVar66);
          auVar62 = vsubps_avx(auVar62,auVar71);
          auVar66 = vfmadd231ps_fma(auVar71,auVar62,auVar137);
          auVar138._0_8_ = CONCAT44(auVar62._4_4_ * 3.0,auVar62._0_4_ * 3.0);
          auVar138._8_4_ = auVar62._8_4_ * 3.0;
          auVar138._12_4_ = auVar62._12_4_ * 3.0;
          auVar239._8_8_ = auVar66._0_8_;
          auVar239._0_8_ = auVar66._0_8_;
          auVar62 = vshufpd_avx(auVar66,auVar66,3);
          auVar66 = vshufps_avx(auVar68,auVar68,0x55);
          auVar75 = vsubps_avx(auVar62,auVar239);
          auVar71 = vfmadd231ps_fma(auVar239,auVar66,auVar75);
          auVar258._8_8_ = auVar138._0_8_;
          auVar258._0_8_ = auVar138._0_8_;
          auVar62 = vshufpd_avx(auVar138,auVar138,3);
          auVar62 = vsubps_avx(auVar62,auVar258);
          auVar66 = vfmadd213ps_fma(auVar62,auVar66,auVar258);
          auVar139._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
          auVar139._8_4_ = auVar75._8_4_ ^ 0x80000000;
          auVar139._12_4_ = auVar75._12_4_ ^ 0x80000000;
          auVar62 = vmovshdup_avx(auVar66);
          auVar259._0_8_ = auVar62._0_8_ ^ 0x8000000080000000;
          auVar259._8_4_ = auVar62._8_4_ ^ 0x80000000;
          auVar259._12_4_ = auVar62._12_4_ ^ 0x80000000;
          auVar72 = vmovshdup_avx512vl(auVar75);
          auVar73 = vpermt2ps_avx512vl(auVar259,ZEXT416(5),auVar75);
          auVar62 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar62._0_4_ * auVar75._0_4_)),auVar66,
                                        auVar72);
          auVar66 = vpermt2ps_avx512vl(auVar66,SUB6416(ZEXT464(4),0),auVar139);
          auVar149._0_4_ = auVar62._0_4_;
          auVar149._4_4_ = auVar149._0_4_;
          auVar149._8_4_ = auVar149._0_4_;
          auVar149._12_4_ = auVar149._0_4_;
          auVar62 = vdivps_avx(auVar73,auVar149);
          auVar66 = vdivps_avx(auVar66,auVar149);
          fVar215 = auVar71._0_4_;
          auVar75 = vshufps_avx(auVar71,auVar71,0x55);
          fVar120 = auVar66._0_4_;
          auVar240._0_4_ = fVar215 * auVar62._0_4_ + auVar75._0_4_ * fVar120;
          auVar240._4_4_ = fVar215 * auVar62._4_4_ + auVar75._4_4_ * auVar66._4_4_;
          auVar240._8_4_ = fVar215 * auVar62._8_4_ + auVar75._8_4_ * auVar66._8_4_;
          auVar240._12_4_ = fVar215 * auVar62._12_4_ + auVar75._12_4_ * auVar66._12_4_;
          auVar69 = vsubps_avx(auVar64,auVar240);
          auVar71 = vmovshdup_avx(auVar62);
          auVar64 = vinsertps_avx(auVar199,auVar221,0x1c);
          auVar260._0_4_ = auVar71._0_4_ * auVar64._0_4_;
          auVar260._4_4_ = auVar71._4_4_ * auVar64._4_4_;
          auVar260._8_4_ = auVar71._8_4_ * auVar64._8_4_;
          auVar260._12_4_ = auVar71._12_4_ * auVar64._12_4_;
          auVar75 = vinsertps_avx(auVar185,auVar231,0x1c);
          auVar241._0_4_ = auVar71._0_4_ * auVar75._0_4_;
          auVar241._4_4_ = auVar71._4_4_ * auVar75._4_4_;
          auVar241._8_4_ = auVar71._8_4_ * auVar75._8_4_;
          auVar241._12_4_ = auVar71._12_4_ * auVar75._12_4_;
          auVar67 = vminps_avx512vl(auVar260,auVar241);
          auVar73 = vmaxps_avx(auVar241,auVar260);
          auVar70 = vmovshdup_avx(auVar66);
          auVar71 = vinsertps_avx(auVar221,auVar199,0x4c);
          auVar222._0_4_ = auVar70._0_4_ * auVar71._0_4_;
          auVar222._4_4_ = auVar70._4_4_ * auVar71._4_4_;
          auVar222._8_4_ = auVar70._8_4_ * auVar71._8_4_;
          auVar222._12_4_ = auVar70._12_4_ * auVar71._12_4_;
          auVar72 = vinsertps_avx(auVar231,auVar185,0x4c);
          auVar232._0_4_ = auVar70._0_4_ * auVar72._0_4_;
          auVar232._4_4_ = auVar70._4_4_ * auVar72._4_4_;
          auVar232._8_4_ = auVar70._8_4_ * auVar72._8_4_;
          auVar232._12_4_ = auVar70._12_4_ * auVar72._12_4_;
          auVar70 = vminps_avx(auVar222,auVar232);
          auVar67 = vaddps_avx512vl(auVar67,auVar70);
          auVar70 = vmaxps_avx(auVar232,auVar222);
          auVar223._0_4_ = auVar73._0_4_ + auVar70._0_4_;
          auVar223._4_4_ = auVar73._4_4_ + auVar70._4_4_;
          auVar223._8_4_ = auVar73._8_4_ + auVar70._8_4_;
          auVar223._12_4_ = auVar73._12_4_ + auVar70._12_4_;
          auVar233._8_8_ = 0x3f80000000000000;
          auVar233._0_8_ = 0x3f80000000000000;
          auVar73 = vsubps_avx(auVar233,auVar223);
          auVar70 = vsubps_avx(auVar233,auVar67);
          auVar67 = vsubps_avx(auVar172,auVar68);
          auVar68 = vsubps_avx(auVar65,auVar68);
          fVar143 = auVar67._0_4_;
          auVar261._0_4_ = fVar143 * auVar73._0_4_;
          fVar229 = auVar67._4_4_;
          auVar261._4_4_ = fVar229 * auVar73._4_4_;
          fVar247 = auVar67._8_4_;
          auVar261._8_4_ = fVar247 * auVar73._8_4_;
          fVar248 = auVar67._12_4_;
          auVar261._12_4_ = fVar248 * auVar73._12_4_;
          auVar74 = vbroadcastss_avx512vl(auVar62);
          auVar64 = vmulps_avx512vl(auVar74,auVar64);
          auVar75 = vmulps_avx512vl(auVar74,auVar75);
          auVar74 = vminps_avx512vl(auVar64,auVar75);
          auVar64 = vmaxps_avx(auVar75,auVar64);
          auVar200._0_4_ = fVar120 * auVar71._0_4_;
          auVar200._4_4_ = fVar120 * auVar71._4_4_;
          auVar200._8_4_ = fVar120 * auVar71._8_4_;
          auVar200._12_4_ = fVar120 * auVar71._12_4_;
          auVar186._0_4_ = fVar120 * auVar72._0_4_;
          auVar186._4_4_ = fVar120 * auVar72._4_4_;
          auVar186._8_4_ = fVar120 * auVar72._8_4_;
          auVar186._12_4_ = fVar120 * auVar72._12_4_;
          auVar75 = vminps_avx(auVar200,auVar186);
          auVar71 = vaddps_avx512vl(auVar74,auVar75);
          auVar72 = vmulps_avx512vl(auVar67,auVar70);
          fVar215 = auVar68._0_4_;
          auVar224._0_4_ = fVar215 * auVar73._0_4_;
          fVar226 = auVar68._4_4_;
          auVar224._4_4_ = fVar226 * auVar73._4_4_;
          fVar227 = auVar68._8_4_;
          auVar224._8_4_ = fVar227 * auVar73._8_4_;
          fVar228 = auVar68._12_4_;
          auVar224._12_4_ = fVar228 * auVar73._12_4_;
          auVar234._0_4_ = fVar215 * auVar70._0_4_;
          auVar234._4_4_ = fVar226 * auVar70._4_4_;
          auVar234._8_4_ = fVar227 * auVar70._8_4_;
          auVar234._12_4_ = fVar228 * auVar70._12_4_;
          auVar75 = vmaxps_avx(auVar186,auVar200);
          auVar187._0_4_ = auVar64._0_4_ + auVar75._0_4_;
          auVar187._4_4_ = auVar64._4_4_ + auVar75._4_4_;
          auVar187._8_4_ = auVar64._8_4_ + auVar75._8_4_;
          auVar187._12_4_ = auVar64._12_4_ + auVar75._12_4_;
          auVar201._8_8_ = 0x3f800000;
          auVar201._0_8_ = 0x3f800000;
          auVar64 = vsubps_avx(auVar201,auVar187);
          auVar75 = vsubps_avx(auVar201,auVar71);
          auVar250._0_4_ = fVar143 * auVar64._0_4_;
          auVar250._4_4_ = fVar229 * auVar64._4_4_;
          auVar250._8_4_ = fVar247 * auVar64._8_4_;
          auVar250._12_4_ = fVar248 * auVar64._12_4_;
          auVar242._0_4_ = fVar143 * auVar75._0_4_;
          auVar242._4_4_ = fVar229 * auVar75._4_4_;
          auVar242._8_4_ = fVar247 * auVar75._8_4_;
          auVar242._12_4_ = fVar248 * auVar75._12_4_;
          auVar188._0_4_ = fVar215 * auVar64._0_4_;
          auVar188._4_4_ = fVar226 * auVar64._4_4_;
          auVar188._8_4_ = fVar227 * auVar64._8_4_;
          auVar188._12_4_ = fVar228 * auVar64._12_4_;
          auVar202._0_4_ = fVar215 * auVar75._0_4_;
          auVar202._4_4_ = fVar226 * auVar75._4_4_;
          auVar202._8_4_ = fVar227 * auVar75._8_4_;
          auVar202._12_4_ = fVar228 * auVar75._12_4_;
          auVar64 = vminps_avx(auVar250,auVar242);
          auVar75 = vminps_avx(auVar188,auVar202);
          auVar71 = vminps_avx(auVar64,auVar75);
          auVar64 = vmaxps_avx(auVar242,auVar250);
          auVar75 = vmaxps_avx(auVar202,auVar188);
          auVar75 = vmaxps_avx(auVar75,auVar64);
          auVar73 = vminps_avx512vl(auVar261,auVar72);
          auVar64 = vminps_avx(auVar224,auVar234);
          auVar64 = vminps_avx(auVar73,auVar64);
          auVar64 = vhaddps_avx(auVar71,auVar64);
          auVar72 = vmaxps_avx512vl(auVar72,auVar261);
          auVar71 = vmaxps_avx(auVar234,auVar224);
          auVar71 = vmaxps_avx(auVar71,auVar72);
          auVar75 = vhaddps_avx(auVar75,auVar71);
          auVar64 = vshufps_avx(auVar64,auVar64,0xe8);
          auVar75 = vshufps_avx(auVar75,auVar75,0xe8);
          auVar189._0_4_ = auVar64._0_4_ + auVar69._0_4_;
          auVar189._4_4_ = auVar64._4_4_ + auVar69._4_4_;
          auVar189._8_4_ = auVar64._8_4_ + auVar69._8_4_;
          auVar189._12_4_ = auVar64._12_4_ + auVar69._12_4_;
          auVar203._0_4_ = auVar75._0_4_ + auVar69._0_4_;
          auVar203._4_4_ = auVar75._4_4_ + auVar69._4_4_;
          auVar203._8_4_ = auVar75._8_4_ + auVar69._8_4_;
          auVar203._12_4_ = auVar75._12_4_ + auVar69._12_4_;
          auVar64 = vmaxps_avx(auVar172,auVar189);
          auVar75 = vminps_avx(auVar203,auVar65);
          uVar46 = vcmpps_avx512vl(auVar75,auVar64,1);
          local_440 = vinsertps_avx(auVar173,auVar174,0x10);
          auVar265 = ZEXT1664(local_440);
          auVar64 = ZEXT416(5);
          if ((uVar46 & 3) == 0) {
            vucomiss_avx512f(auVar51);
            auVar64 = vxorps_avx512vl(auVar64,auVar64);
            auVar273 = ZEXT1664(auVar64);
            if ((uint)uVar42 < 4 && (uVar5 == 0 || lVar45 == 0)) {
              bVar10 = false;
            }
            else {
              lVar45 = 200;
              do {
                auVar75 = vsubss_avx512f(auVar63,auVar69);
                fVar227 = auVar75._0_4_;
                fVar215 = fVar227 * fVar227 * fVar227;
                fVar228 = auVar69._0_4_;
                fVar226 = fVar228 * 3.0 * fVar227 * fVar227;
                fVar227 = fVar227 * fVar228 * fVar228 * 3.0;
                auVar169._4_4_ = fVar215;
                auVar169._0_4_ = fVar215;
                auVar169._8_4_ = fVar215;
                auVar169._12_4_ = fVar215;
                auVar157._4_4_ = fVar226;
                auVar157._0_4_ = fVar226;
                auVar157._8_4_ = fVar226;
                auVar157._12_4_ = fVar226;
                auVar130._4_4_ = fVar227;
                auVar130._0_4_ = fVar227;
                auVar130._8_4_ = fVar227;
                auVar130._12_4_ = fVar227;
                fVar228 = fVar228 * fVar228 * fVar228;
                auVar177._0_4_ = (float)local_420._0_4_ * fVar228;
                auVar177._4_4_ = (float)local_420._4_4_ * fVar228;
                auVar177._8_4_ = fStack_418 * fVar228;
                auVar177._12_4_ = fStack_414 * fVar228;
                auVar75 = vfmadd231ps_fma(auVar177,auVar57,auVar130);
                auVar75 = vfmadd231ps_fma(auVar75,auVar59,auVar157);
                auVar75 = vfmadd231ps_fma(auVar75,auVar60,auVar169);
                auVar131._8_8_ = auVar75._0_8_;
                auVar131._0_8_ = auVar75._0_8_;
                auVar75 = vshufpd_avx(auVar75,auVar75,3);
                auVar65 = vshufps_avx(auVar69,auVar69,0x55);
                auVar75 = vsubps_avx(auVar75,auVar131);
                auVar65 = vfmadd213ps_fma(auVar75,auVar65,auVar131);
                fVar215 = auVar65._0_4_;
                auVar75 = vshufps_avx(auVar65,auVar65,0x55);
                auVar132._0_4_ = auVar62._0_4_ * fVar215 + fVar120 * auVar75._0_4_;
                auVar132._4_4_ = auVar62._4_4_ * fVar215 + auVar66._4_4_ * auVar75._4_4_;
                auVar132._8_4_ = auVar62._8_4_ * fVar215 + auVar66._8_4_ * auVar75._8_4_;
                auVar132._12_4_ = auVar62._12_4_ * fVar215 + auVar66._12_4_ * auVar75._12_4_;
                auVar69 = vsubps_avx(auVar69,auVar132);
                auVar75 = vandps_avx512vl(auVar65,auVar267._0_16_);
                auVar65 = vprolq_avx512vl(auVar75,0x20);
                auVar75 = vmaxss_avx(auVar65,auVar75);
                bVar17 = auVar75._0_4_ <= (float)local_430._0_4_;
                if (auVar75._0_4_ < (float)local_430._0_4_) {
                  auVar62 = vucomiss_avx512f(auVar64);
                  if (bVar17) {
                    auVar63 = vucomiss_avx512f(auVar62);
                    auVar270 = ZEXT1664(auVar63);
                    if (bVar17) {
                      vmovshdup_avx(auVar62);
                      auVar63 = vucomiss_avx512f(auVar64);
                      if (bVar17) {
                        auVar66 = vucomiss_avx512f(auVar63);
                        auVar270 = ZEXT1664(auVar66);
                        if (bVar17) {
                          auVar75 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar68 = vinsertps_avx(auVar75,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar75 = vdpps_avx(auVar68,local_290,0x7f);
                          auVar65 = vdpps_avx(auVar68,local_2a0,0x7f);
                          auVar71 = vdpps_avx(auVar68,local_2b0,0x7f);
                          auVar72 = vdpps_avx(auVar68,local_2c0,0x7f);
                          auVar73 = vdpps_avx(auVar68,local_2d0,0x7f);
                          auVar70 = vdpps_avx(auVar68,local_2e0,0x7f);
                          auVar67 = vdpps_avx(auVar68,local_2f0,0x7f);
                          auVar68 = vdpps_avx(auVar68,local_300,0x7f);
                          auVar69 = vsubss_avx512f(auVar66,auVar63);
                          fVar227 = auVar63._0_4_;
                          auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * auVar73._0_4_)),auVar69
                                                    ,auVar75);
                          auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar70._0_4_ * fVar227)),auVar69
                                                    ,auVar65);
                          auVar65 = vfmadd231ss_fma(ZEXT416((uint)(auVar67._0_4_ * fVar227)),auVar69
                                                    ,auVar71);
                          auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar227 * auVar68._0_4_)),auVar69
                                                    ,auVar72);
                          auVar66 = vsubss_avx512f(auVar66,auVar62);
                          auVar190._0_4_ = auVar66._0_4_;
                          fVar120 = auVar190._0_4_ * auVar190._0_4_ * auVar190._0_4_;
                          local_120 = auVar62._0_4_;
                          fVar215 = local_120 * 3.0 * auVar190._0_4_ * auVar190._0_4_;
                          fVar226 = auVar190._0_4_ * local_120 * local_120 * 3.0;
                          fVar143 = local_120 * local_120 * local_120;
                          auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar143 * auVar71._0_4_)),
                                                    ZEXT416((uint)fVar226),auVar65);
                          auVar66 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar215),auVar75);
                          auVar63 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar120),auVar63);
                          fVar228 = auVar63._0_4_;
                          if ((fVar144 <= fVar228) &&
                             (fVar229 = *(float *)(ray + k * 4 + 0x100), fVar228 <= fVar229)) {
                            auVar63 = vshufps_avx(auVar62,auVar62,0x55);
                            auVar65 = vsubps_avx512vl(auVar181,auVar63);
                            fVar247 = auVar63._0_4_;
                            auVar225._0_4_ = fVar247 * (float)local_320._0_4_;
                            fVar248 = auVar63._4_4_;
                            auVar225._4_4_ = fVar248 * (float)local_320._4_4_;
                            fVar253 = auVar63._8_4_;
                            auVar225._8_4_ = fVar253 * fStack_318;
                            fVar254 = auVar63._12_4_;
                            auVar225._12_4_ = fVar254 * fStack_314;
                            auVar235._0_4_ = fVar247 * (float)local_370._0_4_;
                            auVar235._4_4_ = fVar248 * (float)local_370._4_4_;
                            auVar235._8_4_ = fVar253 * fStack_368;
                            auVar235._12_4_ = fVar254 * fStack_364;
                            auVar243._0_4_ = fVar247 * (float)local_380._0_4_;
                            auVar243._4_4_ = fVar248 * (float)local_380._4_4_;
                            auVar243._8_4_ = fVar253 * fStack_378;
                            auVar243._12_4_ = fVar254 * fStack_374;
                            auVar204._0_4_ = fVar247 * (float)local_340._0_4_;
                            auVar204._4_4_ = fVar248 * (float)local_340._4_4_;
                            auVar204._8_4_ = fVar253 * fStack_338;
                            auVar204._12_4_ = fVar254 * fStack_334;
                            auVar63 = vfmadd231ps_fma(auVar225,auVar65,local_310);
                            auVar66 = vfmadd231ps_fma(auVar235,auVar65,local_350);
                            auVar75 = vfmadd231ps_fma(auVar243,auVar65,local_360);
                            auVar65 = vfmadd231ps_fma(auVar204,auVar65,local_330);
                            auVar63 = vsubps_avx(auVar66,auVar63);
                            auVar66 = vsubps_avx(auVar75,auVar66);
                            auVar75 = vsubps_avx(auVar65,auVar75);
                            auVar244._0_4_ = local_120 * auVar66._0_4_;
                            auVar244._4_4_ = local_120 * auVar66._4_4_;
                            auVar244._8_4_ = local_120 * auVar66._8_4_;
                            auVar244._12_4_ = local_120 * auVar66._12_4_;
                            auVar190._4_4_ = auVar190._0_4_;
                            auVar190._8_4_ = auVar190._0_4_;
                            auVar190._12_4_ = auVar190._0_4_;
                            auVar63 = vfmadd231ps_fma(auVar244,auVar190,auVar63);
                            auVar205._0_4_ = local_120 * auVar75._0_4_;
                            auVar205._4_4_ = local_120 * auVar75._4_4_;
                            auVar205._8_4_ = local_120 * auVar75._8_4_;
                            auVar205._12_4_ = local_120 * auVar75._12_4_;
                            auVar66 = vfmadd231ps_fma(auVar205,auVar190,auVar66);
                            auVar206._0_4_ = local_120 * auVar66._0_4_;
                            auVar206._4_4_ = local_120 * auVar66._4_4_;
                            auVar206._8_4_ = local_120 * auVar66._8_4_;
                            auVar206._12_4_ = local_120 * auVar66._12_4_;
                            auVar63 = vfmadd231ps_fma(auVar206,auVar190,auVar63);
                            auVar20._8_4_ = 0x40400000;
                            auVar20._0_8_ = 0x4040000040400000;
                            auVar20._12_4_ = 0x40400000;
                            auVar63 = vmulps_avx512vl(auVar63,auVar20);
                            pGVar6 = (context->scene->geometries).items[uVar47].ptr;
                            if ((pGVar6->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                              auVar178._0_4_ = fVar143 * (float)local_3c0._0_4_;
                              auVar178._4_4_ = fVar143 * (float)local_3c0._4_4_;
                              auVar178._8_4_ = fVar143 * fStack_3b8;
                              auVar178._12_4_ = fVar143 * fStack_3b4;
                              auVar170._4_4_ = fVar226;
                              auVar170._0_4_ = fVar226;
                              auVar170._8_4_ = fVar226;
                              auVar170._12_4_ = fVar226;
                              auVar66 = vfmadd132ps_fma(auVar170,auVar178,local_3b0);
                              auVar158._4_4_ = fVar215;
                              auVar158._0_4_ = fVar215;
                              auVar158._8_4_ = fVar215;
                              auVar158._12_4_ = fVar215;
                              auVar66 = vfmadd132ps_fma(auVar158,auVar66,local_3a0);
                              auVar150._4_4_ = fVar120;
                              auVar150._0_4_ = fVar120;
                              auVar150._8_4_ = fVar120;
                              auVar150._12_4_ = fVar120;
                              auVar65 = vfmadd132ps_fma(auVar150,auVar66,local_390);
                              auVar66 = vshufps_avx(auVar65,auVar65,0xc9);
                              auVar75 = vshufps_avx(auVar63,auVar63,0xc9);
                              auVar151._0_4_ = auVar65._0_4_ * auVar75._0_4_;
                              auVar151._4_4_ = auVar65._4_4_ * auVar75._4_4_;
                              auVar151._8_4_ = auVar65._8_4_ * auVar75._8_4_;
                              auVar151._12_4_ = auVar65._12_4_ * auVar75._12_4_;
                              auVar63 = vfmsub231ps_fma(auVar151,auVar63,auVar66);
                              local_140 = auVar63._0_4_;
                              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                 (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                *(float *)(ray + k * 4 + 0x100) = fVar228;
                                uVar125 = vextractps_avx(auVar63,1);
                                *(undefined4 *)(ray + k * 4 + 0x180) = uVar125;
                                uVar125 = vextractps_avx(auVar63,2);
                                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar125;
                                *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
                                *(float *)(ray + k * 4 + 0x1e0) = local_120;
                                *(float *)(ray + k * 4 + 0x200) = fVar227;
                                *(uint *)(ray + k * 4 + 0x220) = uVar4;
                                *(uint *)(ray + k * 4 + 0x240) = uVar47;
                                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                              }
                              else {
                                auVar161._8_4_ = 1;
                                auVar161._0_8_ = 0x100000001;
                                auVar161._12_4_ = 1;
                                auVar161._16_4_ = 1;
                                auVar161._20_4_ = 1;
                                auVar161._24_4_ = 1;
                                auVar161._28_4_ = 1;
                                local_100 = vpermps_avx2(auVar161,ZEXT1632(auVar62));
                                auVar81 = vpermps_avx2(auVar161,ZEXT1632(auVar63));
                                auVar171._8_4_ = 2;
                                auVar171._0_8_ = 0x200000002;
                                auVar171._12_4_ = 2;
                                auVar171._16_4_ = 2;
                                auVar171._20_4_ = 2;
                                auVar171._24_4_ = 2;
                                auVar171._28_4_ = 2;
                                local_160 = vpermps_avx2(auVar171,ZEXT1632(auVar63));
                                local_180[0] = (RTCHitN)auVar81[0];
                                local_180[1] = (RTCHitN)auVar81[1];
                                local_180[2] = (RTCHitN)auVar81[2];
                                local_180[3] = (RTCHitN)auVar81[3];
                                local_180[4] = (RTCHitN)auVar81[4];
                                local_180[5] = (RTCHitN)auVar81[5];
                                local_180[6] = (RTCHitN)auVar81[6];
                                local_180[7] = (RTCHitN)auVar81[7];
                                local_180[8] = (RTCHitN)auVar81[8];
                                local_180[9] = (RTCHitN)auVar81[9];
                                local_180[10] = (RTCHitN)auVar81[10];
                                local_180[0xb] = (RTCHitN)auVar81[0xb];
                                local_180[0xc] = (RTCHitN)auVar81[0xc];
                                local_180[0xd] = (RTCHitN)auVar81[0xd];
                                local_180[0xe] = (RTCHitN)auVar81[0xe];
                                local_180[0xf] = (RTCHitN)auVar81[0xf];
                                local_180[0x10] = (RTCHitN)auVar81[0x10];
                                local_180[0x11] = (RTCHitN)auVar81[0x11];
                                local_180[0x12] = (RTCHitN)auVar81[0x12];
                                local_180[0x13] = (RTCHitN)auVar81[0x13];
                                local_180[0x14] = (RTCHitN)auVar81[0x14];
                                local_180[0x15] = (RTCHitN)auVar81[0x15];
                                local_180[0x16] = (RTCHitN)auVar81[0x16];
                                local_180[0x17] = (RTCHitN)auVar81[0x17];
                                local_180[0x18] = (RTCHitN)auVar81[0x18];
                                local_180[0x19] = (RTCHitN)auVar81[0x19];
                                local_180[0x1a] = (RTCHitN)auVar81[0x1a];
                                local_180[0x1b] = (RTCHitN)auVar81[0x1b];
                                local_180[0x1c] = (RTCHitN)auVar81[0x1c];
                                local_180[0x1d] = (RTCHitN)auVar81[0x1d];
                                local_180[0x1e] = (RTCHitN)auVar81[0x1e];
                                local_180[0x1f] = (RTCHitN)auVar81[0x1f];
                                uStack_13c = local_140;
                                uStack_138 = local_140;
                                uStack_134 = local_140;
                                uStack_130 = local_140;
                                uStack_12c = local_140;
                                uStack_128 = local_140;
                                uStack_124 = local_140;
                                fStack_11c = local_120;
                                fStack_118 = local_120;
                                fStack_114 = local_120;
                                fStack_110 = local_120;
                                fStack_10c = local_120;
                                fStack_108 = local_120;
                                fStack_104 = local_120;
                                local_e0 = local_240._0_8_;
                                uStack_d8 = local_240._8_8_;
                                uStack_d0 = local_240._16_8_;
                                uStack_c8 = local_240._24_8_;
                                local_c0 = local_220;
                                vpcmpeqd_avx2(local_220,local_220);
                                uStack_9c = context->user->instID[0];
                                local_a0 = uStack_9c;
                                uStack_98 = uStack_9c;
                                uStack_94 = uStack_9c;
                                uStack_90 = uStack_9c;
                                uStack_8c = uStack_9c;
                                uStack_88 = uStack_9c;
                                uStack_84 = uStack_9c;
                                uStack_7c = context->user->instPrimID[0];
                                local_80 = uStack_7c;
                                uStack_78 = uStack_7c;
                                uStack_74 = uStack_7c;
                                uStack_70 = uStack_7c;
                                uStack_6c = uStack_7c;
                                uStack_68 = uStack_7c;
                                uStack_64 = uStack_7c;
                                *(float *)(ray + k * 4 + 0x100) = fVar228;
                                local_3e0 = local_260._0_8_;
                                uStack_3d8 = local_260._8_8_;
                                uStack_3d0 = local_260._16_8_;
                                uStack_3c8 = local_260._24_8_;
                                local_470.valid = (int *)&local_3e0;
                                local_470.geometryUserPtr = pGVar6->userPtr;
                                local_470.context = context->user;
                                local_470.hit = local_180;
                                local_470.N = 8;
                                local_470.ray = (RTCRayN *)ray;
                                if (pGVar6->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                                  (*pGVar6->intersectionFilterN)(&local_470);
                                  auVar265 = ZEXT1664(local_440);
                                  auVar61 = vxorps_avx512vl(auVar64,auVar64);
                                  auVar273 = ZEXT1664(auVar61);
                                  auVar270 = ZEXT464(0x3f800000);
                                  auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar269 = ZEXT3264(auVar81);
                                  auVar61 = auVar81._16_16_;
                                  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar268 = ZEXT1664(auVar62);
                                  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar267 = ZEXT1664(auVar62);
                                  auVar62 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar266 = ZEXT1664(auVar62);
                                  auVar55 = vxorps_avx512vl(auVar55,auVar55);
                                  auVar274 = ZEXT1664(auVar55);
                                }
                                auVar62 = auVar274._0_16_;
                                auVar55 = auVar273._0_16_;
                                auVar38._8_8_ = uStack_3d8;
                                auVar38._0_8_ = local_3e0;
                                auVar38._16_8_ = uStack_3d0;
                                auVar38._24_8_ = uStack_3c8;
                                if (auVar38 == (undefined1  [32])0x0) {
LAB_01d68137:
                                  *(float *)(ray + k * 4 + 0x100) = fVar229;
                                }
                                else {
                                  p_Var7 = context->args->filter;
                                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                                     (((context->args->flags &
                                       RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                      (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                    (*p_Var7)(&local_470);
                                    auVar265 = ZEXT1664(local_440);
                                    auVar61 = vxorps_avx512vl(auVar55,auVar55);
                                    auVar273 = ZEXT1664(auVar61);
                                    auVar270 = ZEXT464(0x3f800000);
                                    auVar81 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar269 = ZEXT3264(auVar81);
                                    auVar61 = auVar81._16_16_;
                                    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                    auVar268 = ZEXT1664(auVar55);
                                    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar267 = ZEXT1664(auVar55);
                                    auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                    auVar266 = ZEXT1664(auVar55);
                                    auVar55 = vxorps_avx512vl(auVar62,auVar62);
                                    auVar274 = ZEXT1664(auVar55);
                                  }
                                  auVar39._8_8_ = uStack_3d8;
                                  auVar39._0_8_ = local_3e0;
                                  auVar39._16_8_ = uStack_3d0;
                                  auVar39._24_8_ = uStack_3c8;
                                  if (auVar39 == (undefined1  [32])0x0) goto LAB_01d68137;
                                  uVar46 = vptestmd_avx512vl(auVar39,auVar39);
                                  iVar119 = *(int *)(local_470.hit + 4);
                                  iVar272 = *(int *)(local_470.hit + 8);
                                  iVar33 = *(int *)(local_470.hit + 0xc);
                                  iVar34 = *(int *)(local_470.hit + 0x10);
                                  iVar35 = *(int *)(local_470.hit + 0x14);
                                  iVar36 = *(int *)(local_470.hit + 0x18);
                                  iVar37 = *(int *)(local_470.hit + 0x1c);
                                  bVar40 = (byte)uVar46;
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar46 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar46 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar46 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar46 >> 6) & 1);
                                  bVar16 = SUB81(uVar46 >> 7,0);
                                  *(uint *)(local_470.ray + 0x180) =
                                       (uint)(bVar40 & 1) * *(int *)local_470.hit |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_470.ray + 0x180);
                                  *(uint *)(local_470.ray + 0x184) =
                                       (uint)bVar17 * iVar119 |
                                       (uint)!bVar17 * *(int *)(local_470.ray + 0x184);
                                  *(uint *)(local_470.ray + 0x188) =
                                       (uint)bVar11 * iVar272 |
                                       (uint)!bVar11 * *(int *)(local_470.ray + 0x188);
                                  *(uint *)(local_470.ray + 0x18c) =
                                       (uint)bVar12 * iVar33 |
                                       (uint)!bVar12 * *(int *)(local_470.ray + 0x18c);
                                  *(uint *)(local_470.ray + 400) =
                                       (uint)bVar13 * iVar34 |
                                       (uint)!bVar13 * *(int *)(local_470.ray + 400);
                                  *(uint *)(local_470.ray + 0x194) =
                                       (uint)bVar14 * iVar35 |
                                       (uint)!bVar14 * *(int *)(local_470.ray + 0x194);
                                  *(uint *)(local_470.ray + 0x198) =
                                       (uint)bVar15 * iVar36 |
                                       (uint)!bVar15 * *(int *)(local_470.ray + 0x198);
                                  *(uint *)(local_470.ray + 0x19c) =
                                       (uint)bVar16 * iVar37 |
                                       (uint)!bVar16 * *(int *)(local_470.ray + 0x19c);
                                  iVar119 = *(int *)(local_470.hit + 0x24);
                                  iVar272 = *(int *)(local_470.hit + 0x28);
                                  iVar33 = *(int *)(local_470.hit + 0x2c);
                                  iVar34 = *(int *)(local_470.hit + 0x30);
                                  iVar35 = *(int *)(local_470.hit + 0x34);
                                  iVar36 = *(int *)(local_470.hit + 0x38);
                                  iVar37 = *(int *)(local_470.hit + 0x3c);
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar46 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar46 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar46 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar46 >> 6) & 1);
                                  bVar16 = SUB81(uVar46 >> 7,0);
                                  *(uint *)(local_470.ray + 0x1a0) =
                                       (uint)(bVar40 & 1) * *(int *)(local_470.hit + 0x20) |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_470.ray + 0x1a0);
                                  *(uint *)(local_470.ray + 0x1a4) =
                                       (uint)bVar17 * iVar119 |
                                       (uint)!bVar17 * *(int *)(local_470.ray + 0x1a4);
                                  *(uint *)(local_470.ray + 0x1a8) =
                                       (uint)bVar11 * iVar272 |
                                       (uint)!bVar11 * *(int *)(local_470.ray + 0x1a8);
                                  *(uint *)(local_470.ray + 0x1ac) =
                                       (uint)bVar12 * iVar33 |
                                       (uint)!bVar12 * *(int *)(local_470.ray + 0x1ac);
                                  *(uint *)(local_470.ray + 0x1b0) =
                                       (uint)bVar13 * iVar34 |
                                       (uint)!bVar13 * *(int *)(local_470.ray + 0x1b0);
                                  *(uint *)(local_470.ray + 0x1b4) =
                                       (uint)bVar14 * iVar35 |
                                       (uint)!bVar14 * *(int *)(local_470.ray + 0x1b4);
                                  *(uint *)(local_470.ray + 0x1b8) =
                                       (uint)bVar15 * iVar36 |
                                       (uint)!bVar15 * *(int *)(local_470.ray + 0x1b8);
                                  *(uint *)(local_470.ray + 0x1bc) =
                                       (uint)bVar16 * iVar37 |
                                       (uint)!bVar16 * *(int *)(local_470.ray + 0x1bc);
                                  iVar119 = *(int *)(local_470.hit + 0x44);
                                  iVar272 = *(int *)(local_470.hit + 0x48);
                                  iVar33 = *(int *)(local_470.hit + 0x4c);
                                  iVar34 = *(int *)(local_470.hit + 0x50);
                                  iVar35 = *(int *)(local_470.hit + 0x54);
                                  iVar36 = *(int *)(local_470.hit + 0x58);
                                  iVar37 = *(int *)(local_470.hit + 0x5c);
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar46 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar46 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar46 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar46 >> 6) & 1);
                                  bVar16 = SUB81(uVar46 >> 7,0);
                                  *(uint *)(local_470.ray + 0x1c0) =
                                       (uint)(bVar40 & 1) * *(int *)(local_470.hit + 0x40) |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_470.ray + 0x1c0);
                                  *(uint *)(local_470.ray + 0x1c4) =
                                       (uint)bVar17 * iVar119 |
                                       (uint)!bVar17 * *(int *)(local_470.ray + 0x1c4);
                                  *(uint *)(local_470.ray + 0x1c8) =
                                       (uint)bVar11 * iVar272 |
                                       (uint)!bVar11 * *(int *)(local_470.ray + 0x1c8);
                                  *(uint *)(local_470.ray + 0x1cc) =
                                       (uint)bVar12 * iVar33 |
                                       (uint)!bVar12 * *(int *)(local_470.ray + 0x1cc);
                                  *(uint *)(local_470.ray + 0x1d0) =
                                       (uint)bVar13 * iVar34 |
                                       (uint)!bVar13 * *(int *)(local_470.ray + 0x1d0);
                                  *(uint *)(local_470.ray + 0x1d4) =
                                       (uint)bVar14 * iVar35 |
                                       (uint)!bVar14 * *(int *)(local_470.ray + 0x1d4);
                                  *(uint *)(local_470.ray + 0x1d8) =
                                       (uint)bVar15 * iVar36 |
                                       (uint)!bVar15 * *(int *)(local_470.ray + 0x1d8);
                                  *(uint *)(local_470.ray + 0x1dc) =
                                       (uint)bVar16 * iVar37 |
                                       (uint)!bVar16 * *(int *)(local_470.ray + 0x1dc);
                                  iVar119 = *(int *)(local_470.hit + 100);
                                  iVar272 = *(int *)(local_470.hit + 0x68);
                                  iVar33 = *(int *)(local_470.hit + 0x6c);
                                  iVar34 = *(int *)(local_470.hit + 0x70);
                                  iVar35 = *(int *)(local_470.hit + 0x74);
                                  iVar36 = *(int *)(local_470.hit + 0x78);
                                  iVar37 = *(int *)(local_470.hit + 0x7c);
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
                                  bVar12 = (bool)((byte)(uVar46 >> 3) & 1);
                                  bVar13 = (bool)((byte)(uVar46 >> 4) & 1);
                                  bVar14 = (bool)((byte)(uVar46 >> 5) & 1);
                                  bVar15 = (bool)((byte)(uVar46 >> 6) & 1);
                                  bVar16 = SUB81(uVar46 >> 7,0);
                                  *(uint *)(local_470.ray + 0x1e0) =
                                       (uint)(bVar40 & 1) * *(int *)(local_470.hit + 0x60) |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_470.ray + 0x1e0);
                                  *(uint *)(local_470.ray + 0x1e4) =
                                       (uint)bVar17 * iVar119 |
                                       (uint)!bVar17 * *(int *)(local_470.ray + 0x1e4);
                                  *(uint *)(local_470.ray + 0x1e8) =
                                       (uint)bVar11 * iVar272 |
                                       (uint)!bVar11 * *(int *)(local_470.ray + 0x1e8);
                                  *(uint *)(local_470.ray + 0x1ec) =
                                       (uint)bVar12 * iVar33 |
                                       (uint)!bVar12 * *(int *)(local_470.ray + 0x1ec);
                                  *(uint *)(local_470.ray + 0x1f0) =
                                       (uint)bVar13 * iVar34 |
                                       (uint)!bVar13 * *(int *)(local_470.ray + 0x1f0);
                                  *(uint *)(local_470.ray + 500) =
                                       (uint)bVar14 * iVar35 |
                                       (uint)!bVar14 * *(int *)(local_470.ray + 500);
                                  *(uint *)(local_470.ray + 0x1f8) =
                                       (uint)bVar15 * iVar36 |
                                       (uint)!bVar15 * *(int *)(local_470.ray + 0x1f8);
                                  *(uint *)(local_470.ray + 0x1fc) =
                                       (uint)bVar16 * iVar37 |
                                       (uint)!bVar16 * *(int *)(local_470.ray + 0x1fc);
                                  iVar119 = *(int *)(local_470.ray + 0x204);
                                  iVar272 = *(int *)(local_470.ray + 0x208);
                                  iVar33 = *(int *)(local_470.ray + 0x20c);
                                  iVar34 = *(int *)(local_470.ray + 0x210);
                                  iVar35 = *(int *)(local_470.ray + 0x214);
                                  iVar36 = *(int *)(local_470.ray + 0x218);
                                  iVar37 = *(int *)(local_470.ray + 0x21c);
                                  auVar113._0_4_ =
                                       (uint)(bVar40 & 1) * *(int *)(local_470.hit + 0x80) |
                                       (uint)!(bool)(bVar40 & 1) * *(int *)(local_470.ray + 0x200);
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  auVar113._4_4_ =
                                       (uint)bVar17 * *(int *)(local_470.hit + 0x84) |
                                       (uint)!bVar17 * iVar119;
                                  bVar17 = (bool)((byte)(uVar46 >> 2) & 1);
                                  auVar113._8_4_ =
                                       (uint)bVar17 * *(int *)(local_470.hit + 0x88) |
                                       (uint)!bVar17 * iVar272;
                                  bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
                                  auVar113._12_4_ =
                                       (uint)bVar17 * *(int *)(local_470.hit + 0x8c) |
                                       (uint)!bVar17 * iVar33;
                                  bVar17 = (bool)((byte)(uVar46 >> 4) & 1);
                                  auVar113._16_4_ =
                                       (uint)bVar17 * *(int *)(local_470.hit + 0x90) |
                                       (uint)!bVar17 * iVar34;
                                  bVar17 = (bool)((byte)(uVar46 >> 5) & 1);
                                  auVar113._20_4_ =
                                       (uint)bVar17 * *(int *)(local_470.hit + 0x94) |
                                       (uint)!bVar17 * iVar35;
                                  bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
                                  auVar113._24_4_ =
                                       (uint)bVar17 * *(int *)(local_470.hit + 0x98) |
                                       (uint)!bVar17 * iVar36;
                                  bVar17 = SUB81(uVar46 >> 7,0);
                                  auVar113._28_4_ =
                                       (uint)bVar17 * *(int *)(local_470.hit + 0x9c) |
                                       (uint)!bVar17 * iVar37;
                                  *(undefined1 (*) [32])(local_470.ray + 0x200) = auVar113;
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  uVar118 = bVar17 * auVar113._4_4_ | (uint)!bVar17 * iVar119;
                                  auVar29._4_24_ = auVar113._8_24_;
                                  auVar29._0_4_ = uVar118;
                                  auVar114._0_8_ = auVar29._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar46 >> 2) & 1);
                                  auVar114._8_4_ = bVar17 * auVar113._8_4_ | (uint)!bVar17 * iVar272
                                  ;
                                  bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
                                  auVar114._12_4_ =
                                       bVar17 * auVar113._12_4_ | (uint)!bVar17 * iVar33;
                                  bVar17 = (bool)((byte)(uVar46 >> 4) & 1);
                                  auVar114._16_4_ =
                                       bVar17 * auVar113._16_4_ | (uint)!bVar17 * iVar34;
                                  bVar17 = (bool)((byte)(uVar46 >> 5) & 1);
                                  auVar114._20_4_ =
                                       bVar17 * auVar113._20_4_ | (uint)!bVar17 * iVar35;
                                  bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
                                  auVar114._24_4_ =
                                       bVar17 * auVar113._24_4_ | (uint)!bVar17 * iVar36;
                                  bVar17 = SUB81(uVar46 >> 7,0);
                                  auVar114._28_4_ =
                                       bVar17 * auVar113._28_4_ | (uint)!bVar17 * iVar37;
                                  auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                                (local_470.hit + 0xa0));
                                  *(undefined1 (*) [32])(local_470.ray + 0x220) = auVar81;
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  uVar118 = bVar17 * uVar118 | (uint)!bVar17 * iVar119;
                                  auVar30._4_24_ = auVar114._8_24_;
                                  auVar30._0_4_ = uVar118;
                                  auVar115._0_8_ = auVar30._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar46 >> 2) & 1);
                                  auVar115._8_4_ = bVar17 * auVar114._8_4_ | (uint)!bVar17 * iVar272
                                  ;
                                  bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
                                  auVar115._12_4_ =
                                       bVar17 * auVar114._12_4_ | (uint)!bVar17 * iVar33;
                                  bVar17 = (bool)((byte)(uVar46 >> 4) & 1);
                                  auVar115._16_4_ =
                                       bVar17 * auVar114._16_4_ | (uint)!bVar17 * iVar34;
                                  bVar17 = (bool)((byte)(uVar46 >> 5) & 1);
                                  auVar115._20_4_ =
                                       bVar17 * auVar114._20_4_ | (uint)!bVar17 * iVar35;
                                  bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
                                  auVar115._24_4_ =
                                       bVar17 * auVar114._24_4_ | (uint)!bVar17 * iVar36;
                                  bVar17 = SUB81(uVar46 >> 7,0);
                                  auVar115._28_4_ =
                                       bVar17 * auVar114._28_4_ | (uint)!bVar17 * iVar37;
                                  auVar81 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                                (local_470.hit + 0xc0));
                                  *(undefined1 (*) [32])(local_470.ray + 0x240) = auVar81;
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  uVar118 = bVar17 * uVar118 | (uint)!bVar17 * iVar119;
                                  auVar31._4_24_ = auVar115._8_24_;
                                  auVar31._0_4_ = uVar118;
                                  auVar116._0_8_ = auVar31._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar46 >> 2) & 1);
                                  auVar116._8_4_ = bVar17 * auVar115._8_4_ | (uint)!bVar17 * iVar272
                                  ;
                                  bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
                                  auVar116._12_4_ =
                                       bVar17 * auVar115._12_4_ | (uint)!bVar17 * iVar33;
                                  bVar17 = (bool)((byte)(uVar46 >> 4) & 1);
                                  auVar116._16_4_ =
                                       bVar17 * auVar115._16_4_ | (uint)!bVar17 * iVar34;
                                  bVar17 = (bool)((byte)(uVar46 >> 5) & 1);
                                  auVar116._20_4_ =
                                       bVar17 * auVar115._20_4_ | (uint)!bVar17 * iVar35;
                                  bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
                                  auVar116._24_4_ =
                                       bVar17 * auVar115._24_4_ | (uint)!bVar17 * iVar36;
                                  bVar17 = SUB81(uVar46 >> 7,0);
                                  auVar116._28_4_ =
                                       bVar17 * auVar115._28_4_ | (uint)!bVar17 * iVar37;
                                  auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                                (local_470.hit + 0xe0));
                                  *(undefined1 (*) [32])(local_470.ray + 0x260) = auVar81;
                                  bVar17 = (bool)((byte)(uVar46 >> 1) & 1);
                                  auVar32._4_24_ = auVar116._8_24_;
                                  auVar32._0_4_ = bVar17 * uVar118 | (uint)!bVar17 * iVar119;
                                  auVar117._0_8_ = auVar32._0_8_ << 0x20;
                                  bVar17 = (bool)((byte)(uVar46 >> 2) & 1);
                                  auVar117._8_4_ = bVar17 * auVar116._8_4_ | (uint)!bVar17 * iVar272
                                  ;
                                  bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
                                  auVar117._12_4_ =
                                       bVar17 * auVar116._12_4_ | (uint)!bVar17 * iVar33;
                                  bVar17 = (bool)((byte)(uVar46 >> 4) & 1);
                                  auVar117._16_4_ =
                                       bVar17 * auVar116._16_4_ | (uint)!bVar17 * iVar34;
                                  bVar17 = (bool)((byte)(uVar46 >> 5) & 1);
                                  auVar117._20_4_ =
                                       bVar17 * auVar116._20_4_ | (uint)!bVar17 * iVar35;
                                  bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
                                  auVar117._24_4_ =
                                       bVar17 * auVar116._24_4_ | (uint)!bVar17 * iVar36;
                                  bVar17 = SUB81(uVar46 >> 7,0);
                                  auVar117._28_4_ =
                                       bVar17 * auVar116._28_4_ | (uint)!bVar17 * iVar37;
                                  auVar61 = auVar117._16_16_;
                                  auVar81 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                                (local_470.hit + 0x100));
                                  *(undefined1 (*) [32])(local_470.ray + 0x280) = auVar81;
                                }
                                auVar55 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar271 = ZEXT1664(auVar55);
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar45 = lVar45 + -1;
              } while (lVar45 != 0);
            }
          }
          else {
            auVar55 = vxorps_avx512vl(ZEXT416(5),auVar64);
            auVar273 = ZEXT1664(auVar55);
          }
        }
      }
    } while (bVar10);
    auVar61 = vinsertps_avx512f(auVar51,auVar54,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }